

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_convert.cpp
# Opt level: O3

void __thiscall tst_qpromise_convert::fulfillTAsU(tst_qpromise_convert *this)

{
  pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> **pppVar1;
  qsizetype *pqVar2;
  QWeakPointer<QObject> *pQVar3;
  Data *pDVar4;
  QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>_>
  *pQVar5;
  long lVar6;
  function<void_(const_QtPromisePrivate::PromiseError_&)> *pfVar7;
  pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *ppVar8;
  QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
  *pQVar9;
  _Manager_type p_Var10;
  int *piVar11;
  undefined8 uVar12;
  PromiseData<(anonymous_namespace)::Enum1> *pPVar13;
  pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_> *ppVar14;
  QSharedData QVar15;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum1>::Data>
  QVar16;
  PromiseResolver<void> PVar17;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar18;
  PromiseResolver<(anonymous_namespace)::Enum2> PVar19;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QString>_> QVar20;
  PromiseResolver<(anonymous_namespace)::Bar> PVar21;
  PromiseResolver<int> PVar22;
  char cVar23;
  bool bVar24;
  int iVar25;
  uint uVar26;
  undefined4 uVar27;
  PromiseData<(anonymous_namespace)::Enum1> *pPVar28;
  long *plVar30;
  PromiseData<(anonymous_namespace)::Enum1> *pPVar31;
  QSharedData *pQVar32;
  PromiseData<int> *this_00;
  char *pcVar33;
  char *pcVar34;
  PromiseDataBase<(anonymous_namespace)::Enum2,_void_(const_(anonymous_namespace)::Enum2_&)>
  *this_01;
  undefined8 *puVar35;
  PromiseDataBase<void,_void_()> *this_02;
  Data *pDVar36;
  Data *pDVar37;
  QObject *pQVar38;
  PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)> *this_03;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum2>::Data>
  QVar39;
  PromiseData<QString> *this_04;
  Data *pDVar40;
  pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_> *ppVar41;
  code *pcVar42;
  QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>_>
  *old;
  long lVar43;
  PromiseData<(anonymous_namespace)::Enum1> *pPVar44;
  long lVar45;
  pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_> *ppVar46;
  pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_> *ppVar47;
  function<void_(const_QtPromisePrivate::PromiseError_&)> *pfVar48;
  function<void_(const_QtPromisePrivate::PromiseError_&)> *n;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data> QVar49;
  pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_> *this_05;
  long lVar50;
  int iVar51;
  Data *pDVar52;
  pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_> *this_06;
  PromiseData<(anonymous_namespace)::Enum1> *pPVar53;
  QArrayData *pQVar54;
  pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_> *ppVar55;
  _func_int **pp_Var56;
  Data *pDVar57;
  void *pvVar58;
  Data *pDVar59;
  pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *ppVar60;
  pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_> *ppVar61;
  QSharedData *pQVar62;
  PromiseData<(anonymous_namespace)::Enum1> *pPVar63;
  QSharedData *pQVar64;
  QByteArrayView QVar65;
  QStringView QVar66;
  QStringView QVar67;
  QStringView QVar68;
  QStringView QVar69;
  QStringView QVar70;
  QStringView QVar71;
  pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> local_328;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum1>::Data>
  local_2f8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data> local_2f0;
  PromiseResolver<void> resolver_3;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<(anonymous_namespace)::Enum1>_>
  QStack_2e0;
  PromiseData<(anonymous_namespace)::Enum1> *local_2d8;
  function<void_(const_QtPromisePrivate::PromiseError_&)> *pfStack_2d0;
  QPromise<int> p;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_2b8;
  PromiseData<(anonymous_namespace)::Enum1> *pPStack_2b0;
  QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
  *local_2a8;
  function<void_(const_QtPromisePrivate::PromiseError_&)> *pfStack_2a0;
  PromiseResolver<double> resolver;
  PromiseResolver<(anonymous_namespace)::Enum2> resolver_4;
  undefined8 uStack_270;
  QPromise<QString> p_3;
  PromiseResolver<(anonymous_namespace)::Bar> resolver_7;
  pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_> *local_208;
  pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_> *local_200;
  PromiseResolver<(anonymous_namespace)::Enum1> resolver_2;
  PromiseResolver<void> resolver_8;
  PromiseResolver<int> resolver_1;
  undefined1 local_174 [12];
  undefined8 *local_168;
  undefined8 uStack_160;
  QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
  *local_158;
  function<void_(const_QtPromisePrivate::PromiseError_&)> *pfStack_150;
  QSharedData *local_140;
  _Any_data local_138;
  code *local_128;
  code *pcStack_120;
  _Any_data local_118;
  code *local_108;
  code *pcStack_100;
  _Any_data local_f8;
  code *local_e8;
  code *pcStack_e0;
  _Any_data local_d8;
  code *local_c8;
  code *pcStack_c0;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  PromiseData<(anonymous_namespace)::Enum1> *local_38;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<(anonymous_namespace)::Enum1>_> QVar29;
  
  resolver_2.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum1>::Data>
        )&DAT_404510a3d70a3d71;
  resolver_3.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       &PTR__QPromiseBase_001500e0;
  pPVar28 = (PromiseData<(anonymous_namespace)::Enum1> *)operator_new(0x68);
  ((PromiseDataBase<int,_void_(const_int_&)> *)
  &pPVar28->
   super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>)
  ->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)
   &((PromiseDataBase<int,_void_(const_int_&)> *)
    &pPVar28->
     super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
    )->super_QSharedData = 0;
  *(undefined8 *)
   &((PromiseDataBase<int,_void_(const_int_&)> *)
    &pPVar28->
     super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
    )->m_lock = 0;
  *(undefined8 *)
   &((PromiseDataBase<int,_void_(const_int_&)> *)
    &pPVar28->
     super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
    )->m_settled = 0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar28->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_handlers).d.d = (Data *)0x0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar28->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar28->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_handlers).d.size = 0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar28->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_catchers).d.d = (Data *)0x0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar28->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar28->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_catchers).d.size = 0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar28->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_error).m_data._M_exception_object = (void *)0x0;
  (pPVar28->m_value).m_data.
  super___shared_ptr<(anonymous_namespace)::Enum1,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar28->m_value).m_data.
  super___shared_ptr<(anonymous_namespace)::Enum1,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ((PromiseDataBase<int,_void_(const_int_&)> *)
  &pPVar28->
   super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>)
  ->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_001502e0;
  QReadWriteLock::QReadWriteLock
            (&((PromiseDataBase<int,_void_(const_int_&)> *)
              &pPVar28->
               super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
              )->m_lock,0);
  ((PromiseDataBase<int,_void_(const_int_&)> *)
  &pPVar28->
   super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>)
  ->m_settled = false;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar28->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_handlers).d.d = (Data *)0x0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar28->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar28->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_handlers).d.size = 0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar28->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_catchers).d.d = (Data *)0x0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar28->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar28->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_catchers).d.size = 0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar28->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_error).m_data._M_exception_object = (void *)0x0;
  ((PromiseDataBase<int,_void_(const_int_&)> *)
  &pPVar28->
   super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>)
  ->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseData_00150268;
  (pPVar28->m_value).m_data.
  super___shared_ptr<(anonymous_namespace)::Enum1,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar28->m_value).m_data.
  super___shared_ptr<(anonymous_namespace)::Enum1,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LOCK();
  pQVar32 = &((PromiseDataBase<int,_void_(const_int_&)> *)
             &pPVar28->
              super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
             )->super_QSharedData;
  (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar28 != (PromiseData<(anonymous_namespace)::Enum1> *)0x0) {
    LOCK();
    pQVar32 = &((PromiseDataBase<int,_void_(const_int_&)> *)
               &pPVar28->
                super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
               )->super_QSharedData;
    (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_328.first.wp.d = (Data *)&PTR__QPromiseBase_00150230;
  local_328.first.wp.value = (QObject *)pPVar28;
  QStack_2e0.d = pPVar28;
  QtPromisePrivate::PromiseResolver<double>::PromiseResolver
            (&resolver,(QPromise<double> *)&local_328);
  local_328.first.wp.d = (Data *)&PTR__QPromiseBase_001500e0;
  if ((PromiseData<(anonymous_namespace)::Enum1> *)local_328.first.wp.value !=
      (PromiseData<(anonymous_namespace)::Enum1> *)0x0) {
    LOCK();
    pQVar32 = &((PromiseDataBase<int,_void_(const_int_&)> *)&(local_328.first.wp.value)->field_0x0)
               ->super_QSharedData;
    (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseData<(anonymous_namespace)::Enum1> *)local_328.first.wp.value !=
        (PromiseData<(anonymous_namespace)::Enum1> *)0x0)) {
      (*((PromiseDataBase<int,_void_(const_int_&)> *)&(local_328.first.wp.value)->field_0x0)->
        _vptr_PromiseDataBase[1])();
    }
  }
  if (resolver.m_d.d == (Data *)0x0) {
    resolver_4.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum2>::Data>
          )(Data *)0x0;
LAB_00109808:
    bVar24 = true;
    QVar49.d = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    resolver_4.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum2>::Data>
          )(QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum2>::Data>
            )resolver.m_d.d;
    if (resolver.m_d.d == (Data *)0x0) goto LAB_00109808;
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    bVar24 = false;
    QVar49 = resolver.m_d.d;
  }
  QtPromisePrivate::PromiseResolver<double>::resolve<double>
            ((PromiseResolver<double> *)&resolver_4,(double *)&resolver_2);
  if (!bVar24) {
    LOCK();
    ((QVar49.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar49.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QVar49.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
        ._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(QVar49.d,0x10);
    }
  }
  if (resolver_4.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_4.m_d.d = *(int *)resolver_4.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_4.m_d.d == 0) {
      operator_delete((void *)resolver_4.m_d.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver.m_d.d == 0) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  resolver_3.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       &PTR__QPromiseBase_00150230;
  QtPromise::QPromise<double>::convert<int>((QPromise<double> *)&p);
  resolver_3.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       &PTR__QPromiseBase_001500e0;
  if (QStack_2e0.d != (PromiseData<(anonymous_namespace)::Enum1> *)0x0) {
    LOCK();
    pQVar32 = &((PromiseDataBase<int,_void_(const_int_&)> *)
               &(QStack_2e0.d)->
                super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
               )->super_QSharedData;
    (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (QStack_2e0.d != (PromiseData<(anonymous_namespace)::Enum1> *)0x0)) {
      (*((PromiseDataBase<int,_void_(const_int_&)> *)
        &(QStack_2e0.d)->
         super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
        )->_vptr_PromiseDataBase[1])();
    }
  }
  iVar25 = waitForValue<int>(&p,(int *)0xffffffff);
  cVar23 = QTest::qCompare(iVar25,0x2a,"waitForValue(p, -1)","42",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                           ,0x4f);
  QVar18 = p.super_QPromiseBase<int>.m_d;
  if (cVar23 == '\0') {
    cVar23 = '\0';
  }
  else {
    bVar24 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                       (&(p.super_QPromiseBase<int>.m_d.d)->
                         super_PromiseDataBase<int,_void_(const_int_&)>);
    cVar23 = QTest::qVerify((bool)(~bVar24 &
                                  ((QVar18.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
                                  m_error.m_data._M_exception_object == (void *)0x0),
                            "p.isFulfilled()","",
                            "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                            ,0x50);
  }
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00150110;
  if (p.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar32 = &((p.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
               super_QSharedData;
    (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((p.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  if (cVar23 == '\0') {
    return;
  }
  local_168 = (undefined8 *)CONCAT44(local_168._4_4_,1);
  QtPromise::resolve<(anonymous_namespace)::Enum1>((QtPromise *)&resolver_4,(Enum1 *)&local_168);
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)0x0;
  p.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x0;
  pPStack_2b0 = (PromiseData<(anonymous_namespace)::Enum1> *)
                std::
                _Function_handler<int_(const_(anonymous_namespace)::Enum1_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:569:16)>
                ::_M_invoke;
  local_2b8.d = (Data *)std::
                        _Function_handler<int_(const_(anonymous_namespace)::Enum1_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:569:16)>
                        ::_M_manager;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data>)
       &PTR__QPromiseBase_00150110;
  pPVar28 = (PromiseData<(anonymous_namespace)::Enum1> *)operator_new(0x68);
  ((PromiseDataBase<int,_void_(const_int_&)> *)
  &pPVar28->
   super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>)
  ->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)
   &((PromiseDataBase<int,_void_(const_int_&)> *)
    &pPVar28->
     super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
    )->super_QSharedData = 0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar28->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_error).m_data._M_exception_object = (void *)0x0;
  (pPVar28->m_value).m_data.
  super___shared_ptr<(anonymous_namespace)::Enum1,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar28->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar28->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_catchers).d.size = 0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar28->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_handlers).d.size = 0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar28->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_catchers).d.d = (Data *)0x0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar28->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_handlers).d.d = (Data *)0x0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar28->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  *(undefined8 *)
   &((PromiseDataBase<int,_void_(const_int_&)> *)
    &pPVar28->
     super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
    )->m_lock = 0;
  *(undefined8 *)
   &((PromiseDataBase<int,_void_(const_int_&)> *)
    &pPVar28->
     super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
    )->m_settled = 0;
  (pPVar28->m_value).m_data.
  super___shared_ptr<(anonymous_namespace)::Enum1,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ((PromiseDataBase<int,_void_(const_int_&)> *)
  &pPVar28->
   super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>)
  ->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_00150420;
  QReadWriteLock::QReadWriteLock
            (&((PromiseDataBase<int,_void_(const_int_&)> *)
              &pPVar28->
               super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
              )->m_lock,0);
  ((PromiseDataBase<int,_void_(const_int_&)> *)
  &pPVar28->
   super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>)
  ->m_settled = false;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar28->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_handlers).d.d = (Data *)0x0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar28->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar28->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_handlers).d.size = 0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar28->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_catchers).d.d = (Data *)0x0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar28->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar28->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_catchers).d.size = 0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar28->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_error).m_data._M_exception_object = (void *)0x0;
  ((PromiseDataBase<int,_void_(const_int_&)> *)
  &pPVar28->
   super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>)
  ->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseData_001503b8;
  (pPVar28->m_value).m_data.
  super___shared_ptr<(anonymous_namespace)::Enum1,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar28->m_value).m_data.
  super___shared_ptr<(anonymous_namespace)::Enum1,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LOCK();
  pQVar32 = &((PromiseDataBase<int,_void_(const_int_&)> *)
             &pPVar28->
              super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
             )->super_QSharedData;
  (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar28 != (PromiseData<(anonymous_namespace)::Enum1> *)0x0) {
    LOCK();
    pQVar32 = &((PromiseDataBase<int,_void_(const_int_&)> *)
               &pPVar28->
                super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
               )->super_QSharedData;
    (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  resolver_3.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       &PTR__QPromiseBase_00150380;
  QStack_2e0.d = pPVar28;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver_1,(QPromise<int> *)&resolver_3);
  local_2f0.d = (Data *)&PTR__QPromiseBase_00150380;
  resolver_3.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       &PTR__QPromiseBase_00150110;
  QVar29.d = QStack_2e0.d;
  if (QStack_2e0.d != (PromiseData<(anonymous_namespace)::Enum1> *)0x0) {
    LOCK();
    pQVar32 = &((PromiseDataBase<int,_void_(const_int_&)> *)
               &(QStack_2e0.d)->
                super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
               )->super_QSharedData;
    (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (QStack_2e0.d != (PromiseData<(anonymous_namespace)::Enum1> *)0x0)) {
      uVar26 = (*((PromiseDataBase<int,_void_(const_int_&)> *)
                 &(QStack_2e0.d)->
                  super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                 )->_vptr_PromiseDataBase[1])();
      QVar29.d = (PromiseData<(anonymous_namespace)::Enum1> *)(ulong)uVar26;
    }
  }
  PVar22.m_d.d = resolver_1.m_d.d;
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_328.first.wp.d = (Data *)0x0;
LAB_00109b24:
    local_328.first.wp.value = (QObject *)0x0;
    local_2f8.d._0_4_ = (undefined4)CONCAT71((int7)((ulong)QVar29.d >> 8),1);
  }
  else {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    if (resolver_1.m_d.d == (Data *)0x0) {
      local_328.first.wp.d = (Data *)resolver_1.m_d.d;
      LOCK();
      iRam0000000000000000 = iRam0000000000000000 + 1;
      UNLOCK();
      goto LAB_00109b24;
    }
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    local_328.first.wp.d = (Data *)resolver_1.m_d.d;
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    local_328.first.wp.value = (QObject *)resolver_1.m_d.d;
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    local_2f8.d._0_4_ = 0;
  }
  pQVar38 = local_328.first.wp.value;
  pfVar48 = &local_328.second;
  std::function<int_(const_(anonymous_namespace)::Enum1_&)>::function
            ((function<int_(const_(anonymous_namespace)::Enum1_&)> *)pfVar48,
             (function<int_(const_(anonymous_namespace)::Enum1_&)> *)&p);
  local_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  plVar30 = (long *)operator_new(0x30);
  *plVar30 = (long)local_328.first.wp.d;
  if ((Data *)local_328.first.wp.d != (Data *)0x0) {
    LOCK();
    (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  plVar30[1] = (long)local_328.first.wp.value;
  if ((Data *)local_328.first.wp.value != (Data *)0x0) {
    LOCK();
    (((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  std::function<int_(const_(anonymous_namespace)::Enum1_&)>::function
            ((function<int_(const_(anonymous_namespace)::Enum1_&)> *)(plVar30 + 2),
             (function<int_(const_(anonymous_namespace)::Enum1_&)> *)pfVar48);
  pcStack_80 = std::
               _Function_handler<void_(const_(anonymous_namespace)::Enum1_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(const_(anonymous_namespace)::Enum1_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
             ::_M_manager;
  local_98._M_unused._M_object = plVar30;
  if (local_328.second.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_328.second.super__Function_base._M_manager)
              ((_Any_data *)pfVar48,(_Any_data *)pfVar48,__destroy_functor);
  }
  QVar16.d = local_2f8.d;
  if ((Data *)local_328.first.wp.value != (Data *)0x0) {
    LOCK();
    (((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_328.first.wp.value,0x10);
    }
  }
  if ((Data *)local_328.first.wp.d != (Data *)0x0) {
    LOCK();
    (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_328.first.wp.d,0x10);
    }
  }
  QtPromisePrivate::
  PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>::
  addHandler((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
              *)uStack_270,(function<void_(const_(anonymous_namespace)::Enum1_&)> *)&local_98);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  cVar23 = (char)QVar16.d;
  if (cVar23 == '\0') {
    LOCK();
    (((QSharedData *)&pQVar38->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&pQVar38->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_128 = (code *)0x0;
  pcStack_120 = (code *)0x0;
  local_138._M_unused._M_object = (void *)0x0;
  local_138._8_8_ = 0;
  local_138._M_unused._M_object = operator_new(8);
  *(QObject **)local_138._M_unused._0_8_ = pQVar38;
  if (cVar23 == '\0') {
    LOCK();
    (((QSharedData *)&pQVar38->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&pQVar38->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pcStack_120 = std::
                  _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
                  ::_M_invoke;
    local_128 = std::
                _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
                ::_M_manager;
    LOCK();
    (((QSharedData *)&pQVar38->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&pQVar38->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QSharedData *)&pQVar38->field_0x0)->ref).super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(pQVar38,0x10);
    }
  }
  else {
    pcStack_120 = std::
                  _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
                  ::_M_invoke;
    local_128 = std::
                _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
                ::_M_manager;
  }
  QtPromisePrivate::
  PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>::
  addCatcher((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
              *)uStack_270,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_138);
  if (local_128 != (code *)0x0) {
    (*local_128)(&local_138,&local_138,__destroy_functor);
  }
  if (cVar23 == '\0') {
    LOCK();
    (((QSharedData *)&pQVar38->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&pQVar38->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QSharedData *)&pQVar38->field_0x0)->ref).super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(pQVar38,0x10);
    }
  }
  if (PVar22.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar22.m_d.d = *(int *)PVar22.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar22.m_d.d == 0) {
      operator_delete((void *)PVar22.m_d.d,0x10);
    }
  }
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_1.m_d.d == 0) {
      operator_delete((void *)resolver_1.m_d.d,0x10);
    }
  }
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data>)
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data>)local_2f0.d;
  bVar24 = QtPromisePrivate::
           PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
           ::isPending((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                        *)uStack_270);
  if (!bVar24) {
    QtPromisePrivate::
    PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>::
    dispatch((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
              *)uStack_270);
  }
  if (local_2b8.d != (Data *)0x0) {
    (*(code *)local_2b8.d)((_Any_data *)&p,(_Any_data *)&p,__destroy_functor);
  }
  resolver_4.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum2>::Data>
        )&PTR__QPromiseBase_0014f310;
  LOCK();
  pQVar32 = (QSharedData *)(uStack_270 + 8);
  (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if (((pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i == 0) &&
     ((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)> *)
      uStack_270 !=
      (PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)> *)
      0x0)) {
    (**(code **)(*(long *)uStack_270 + 8))();
  }
  iVar25 = waitForValue<int>((QPromise<int> *)&resolver,(int *)0xffffffff);
  cVar23 = QTest::qCompare(iVar25,1,"waitForValue(p, -1)","1",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                           ,0x59);
  if (cVar23 == '\0') {
    if (pPVar28 == (PromiseData<(anonymous_namespace)::Enum1> *)0x0) {
      return;
    }
    cVar23 = '\0';
  }
  else {
    bVar24 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                       ((PromiseDataBase<int,_void_(const_int_&)> *)pPVar28);
    cVar23 = QTest::qVerify((bool)(~bVar24 &
                                  (((PromiseDataBase<int,_void_(const_int_&)> *)
                                   &pPVar28->
                                    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                                   )->m_error).m_data._M_exception_object == (void *)0x0),
                            "p.isFulfilled()","",
                            "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                            ,0x5a);
  }
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data>)
       &PTR__QPromiseBase_00150110;
  LOCK();
  pQVar32 = &((PromiseDataBase<int,_void_(const_int_&)> *)
             &pPVar28->
              super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
             )->super_QSharedData;
  (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if (((pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i == 0) &&
     (pPVar28 != (PromiseData<(anonymous_namespace)::Enum1> *)0x0)) {
    (*((PromiseDataBase<int,_void_(const_int_&)> *)
      &pPVar28->
       super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
      )->_vptr_PromiseDataBase[1])();
  }
  if (cVar23 == '\0') {
    return;
  }
  resolver_1.m_d.d._0_4_ = 1;
  QtPromise::resolve<int>((QtPromise *)&resolver,(int *)&resolver_1);
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)0x0;
  p.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x0;
  pPStack_2b0 = (PromiseData<(anonymous_namespace)::Enum1> *)
                std::
                _Function_handler<(anonymous_namespace)::Enum1_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:569:16)>
                ::_M_invoke;
  local_2b8.d = (Data *)std::
                        _Function_handler<(anonymous_namespace)::Enum1_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:569:16)>
                        ::_M_manager;
  pPVar31 = (PromiseData<(anonymous_namespace)::Enum1> *)operator_new(0x68);
  (pPVar31->
  super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>).
  _vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)
   &(pPVar31->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
    ).super_QSharedData = 0;
  (pPVar31->
  super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>).
  m_error.m_data._M_exception_object = (void *)0x0;
  (pPVar31->m_value).m_data.
  super___shared_ptr<(anonymous_namespace)::Enum1,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar31->
  super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>).
  m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar31->
  super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>).
  m_catchers.d.size = 0;
  (pPVar31->
  super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>).
  m_handlers.d.size = 0;
  (pPVar31->
  super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>).
  m_catchers.d.d = (Data *)0x0;
  (pPVar31->
  super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>).
  m_handlers.d.d = (Data *)0x0;
  (pPVar31->
  super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>).
  m_handlers.d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  *(undefined8 *)
   &(pPVar31->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
    ).m_lock = 0;
  *(undefined8 *)
   &(pPVar31->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
    ).m_settled = 0;
  (pPVar31->m_value).m_data.
  super___shared_ptr<(anonymous_namespace)::Enum1,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pPVar31->
  super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>).
  _vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0014f640;
  QReadWriteLock::QReadWriteLock
            (&(pPVar31->
              super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
              ).m_lock,0);
  (pPVar31->
  super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>).
  m_settled = false;
  (pPVar31->
  super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>).
  m_handlers.d.d = (Data *)0x0;
  (pPVar31->
  super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>).
  m_handlers.d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  (pPVar31->
  super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>).
  m_handlers.d.size = 0;
  (pPVar31->
  super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>).
  m_catchers.d.d = (Data *)0x0;
  (pPVar31->
  super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>).
  m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar31->
  super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>).
  m_catchers.d.size = 0;
  (pPVar31->
  super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>).
  m_error.m_data._M_exception_object = (void *)0x0;
  (pPVar31->
  super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>).
  _vptr_PromiseDataBase = (_func_int **)&PTR__PromiseData_0014f5d8;
  (pPVar31->m_value).m_data.
  super___shared_ptr<(anonymous_namespace)::Enum1,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar31->m_value).m_data.
  super___shared_ptr<(anonymous_namespace)::Enum1,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LOCK();
  pQVar32 = &(pPVar31->
             super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
             ).super_QSharedData;
  (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  pQVar32 = &(pPVar31->
             super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
             ).super_QSharedData;
  (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar32 = &(pPVar31->
             super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
             ).super_QSharedData;
  resolver_3.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       &PTR__QPromiseBase_0014f5a0;
  QStack_2e0.d = pPVar31;
  QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum1>::PromiseResolver
            (&resolver_2,(QPromise<(anonymous_namespace)::Enum1> *)&resolver_3);
  resolver_3.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       &PTR__QPromiseBase_0014f310;
  QVar29.d = QStack_2e0.d;
  if (QStack_2e0.d != (PromiseData<(anonymous_namespace)::Enum1> *)0x0) {
    LOCK();
    pQVar64 = &((QStack_2e0.d)->
               super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
               ).super_QSharedData;
    (pQVar64->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar64->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar64->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (QStack_2e0.d != (PromiseData<(anonymous_namespace)::Enum1> *)0x0)) {
      uVar26 = (*((QStack_2e0.d)->
                 super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                 )._vptr_PromiseDataBase[1])();
      QVar29.d = (PromiseData<(anonymous_namespace)::Enum1> *)(ulong)uVar26;
    }
  }
  if (resolver_2.m_d.d == (Data *)0x0) {
    local_328.first.wp.d = (Data *)0x0;
LAB_0010a012:
    local_328.first.wp.value = (QObject *)0x0;
    uVar27 = (undefined4)CONCAT71((int7)((ulong)QVar29.d >> 8),1);
  }
  else {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
    UNLOCK();
    if (resolver_2.m_d.d == (Data *)0x0) {
      local_328.first.wp.d = (Data *)resolver_2.m_d.d;
      LOCK();
      iRam0000000000000000 = iRam0000000000000000 + 1;
      UNLOCK();
      goto LAB_0010a012;
    }
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
    UNLOCK();
    local_328.first.wp.d = (Data *)resolver_2.m_d.d;
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
    UNLOCK();
    local_328.first.wp.value = (QObject *)resolver_2.m_d.d;
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
    UNLOCK();
    uVar27 = 0;
  }
  pQVar38 = local_328.first.wp.value;
  local_2f8 = resolver_2.m_d.d;
  local_2f0.d._0_4_ = uVar27;
  pfVar48 = &local_328.second;
  std::function<(anonymous_namespace)::Enum1_(const_int_&)>::function
            ((function<(anonymous_namespace)::Enum1_(const_int_&)> *)pfVar48,
             (function<(anonymous_namespace)::Enum1_(const_int_&)> *)&p);
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  plVar30 = (long *)operator_new(0x30);
  *plVar30 = (long)local_328.first.wp.d;
  if ((Data *)local_328.first.wp.d != (Data *)0x0) {
    LOCK();
    (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  plVar30[1] = (long)local_328.first.wp.value;
  if ((Data *)local_328.first.wp.value != (Data *)0x0) {
    LOCK();
    (((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  std::function<(anonymous_namespace)::Enum1_(const_int_&)>::function
            ((function<(anonymous_namespace)::Enum1_(const_int_&)> *)(plVar30 + 2),
             (function<(anonymous_namespace)::Enum1_(const_int_&)> *)pfVar48);
  pcStack_60 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
             ::_M_manager;
  local_78._M_unused._M_object = plVar30;
  if (local_328.second.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_328.second.super__Function_base._M_manager)
              ((_Any_data *)pfVar48,(_Any_data *)pfVar48,__destroy_functor);
  }
  QVar49.d = local_2f0.d;
  if ((Data *)local_328.first.wp.value != (Data *)0x0) {
    LOCK();
    (((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_328.first.wp.value,0x10);
    }
  }
  if ((Data *)local_328.first.wp.d != (Data *)0x0) {
    LOCK();
    (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_328.first.wp.d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            ((PromiseDataBase<int,_void_(const_int_&)> *)pPVar28,
             (function<void_(const_int_&)> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  cVar23 = (char)QVar49.d;
  if (cVar23 == '\0') {
    LOCK();
    (((QSharedData *)&pQVar38->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&pQVar38->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_108 = (code *)0x0;
  pcStack_100 = (code *)0x0;
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  local_118._M_unused._M_object = operator_new(8);
  *(QObject **)local_118._M_unused._0_8_ = pQVar38;
  if (cVar23 == '\0') {
    LOCK();
    (((QSharedData *)&pQVar38->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&pQVar38->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pcStack_100 = std::
                  _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
                  ::_M_invoke;
    local_108 = std::
                _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
                ::_M_manager;
    LOCK();
    (((QSharedData *)&pQVar38->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&pQVar38->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QSharedData *)&pQVar38->field_0x0)->ref).super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(pQVar38,0x10);
    }
  }
  else {
    pcStack_100 = std::
                  _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
                  ::_M_invoke;
    local_108 = std::
                _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
                ::_M_manager;
  }
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            ((PromiseDataBase<int,_void_(const_int_&)> *)pPVar28,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_118);
  if (local_108 != (code *)0x0) {
    (*local_108)(&local_118,&local_118,__destroy_functor);
  }
  if (cVar23 == '\0') {
    LOCK();
    (((QSharedData *)&pQVar38->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&pQVar38->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QSharedData *)&pQVar38->field_0x0)->ref).super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(pQVar38,0x10);
    }
  }
  if (local_2f8.d != (Data *)0x0) {
    LOCK();
    ((local_2f8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_2f8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_2f8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_2f8.d,0x10);
    }
  }
  if (resolver_2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_2.m_d.d == 0) {
      operator_delete((void *)resolver_2.m_d.d,0x10);
    }
  }
  bVar24 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                     ((PromiseDataBase<int,_void_(const_int_&)> *)pPVar28);
  if (!bVar24) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              ((PromiseDataBase<int,_void_(const_int_&)> *)pPVar28);
  }
  if (local_2b8.d != (Data *)0x0) {
    (*(code *)local_2b8.d)((_Any_data *)&p,(_Any_data *)&p,__destroy_functor);
  }
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data>)
       &PTR__QPromiseBase_00150110;
  LOCK();
  pQVar64 = &((PromiseDataBase<int,_void_(const_int_&)> *)
             &pPVar28->
              super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
             )->super_QSharedData;
  (pQVar64->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar64->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if (((pQVar64->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i == 0) &&
     (pPVar28 != (PromiseData<(anonymous_namespace)::Enum1> *)0x0)) {
    (*((PromiseDataBase<int,_void_(const_int_&)> *)
      &pPVar28->
       super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
      )->_vptr_PromiseDataBase[1])();
  }
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data>)
       ((ulong)resolver.m_d.d & 0xffffffff00000000);
  this_00 = (PromiseData<int> *)operator_new(0x58);
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  *(undefined8 *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_00150568;
  QReadWriteLock::QReadWriteLock
            (&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock,0);
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = false;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_00150500;
  LOCK();
  pQVar64 = &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar64->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar64->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  pQVar64 = &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar64->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar64->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar64 = &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  local_174._4_8_ = &PTR__QPromiseBase_001504c8;
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001504c8;
  p.super_QPromiseBase<int>.m_d.d = this_00;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver_3,(QPromise<void> *)&p);
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001501a0;
  if (p.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar62 = &((p.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
               super_QSharedData;
    (pQVar62->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar62->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar62->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((p.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  PVar17.m_d.d = resolver_3.m_d.d;
  if (resolver_3.m_d.d == (Data *)0x0) {
    local_328.first.wp.d = (Data *)0x0;
LAB_0010a406:
    local_328.first.wp.value = (QObject *)0x0;
    bVar24 = true;
  }
  else {
    LOCK();
    *(int *)resolver_3.m_d.d = *(int *)resolver_3.m_d.d + 1;
    UNLOCK();
    if (resolver_3.m_d.d == (Data *)0x0) {
      local_328.first.wp.d = (Data *)resolver_3.m_d.d;
      LOCK();
      iRam0000000000000000 = iRam0000000000000000 + 1;
      UNLOCK();
      goto LAB_0010a406;
    }
    LOCK();
    *(int *)resolver_3.m_d.d = *(int *)resolver_3.m_d.d + 1;
    UNLOCK();
    local_328.first.wp.d = (Data *)resolver_3.m_d.d;
    LOCK();
    *(int *)resolver_3.m_d.d = *(int *)resolver_3.m_d.d + 1;
    UNLOCK();
    local_328.first.wp.value = (QObject *)resolver_3.m_d.d;
    LOCK();
    *(int *)resolver_3.m_d.d = *(int *)resolver_3.m_d.d + 1;
    UNLOCK();
    bVar24 = false;
  }
  pQVar38 = local_328.first.wp.value;
  local_328.second.super__Function_base._M_functor._M_unused._M_object = &resolver;
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  local_c8 = (code *)0x0;
  pcStack_c0 = (code *)0x0;
  local_d8._M_unused._M_object = operator_new(0x18);
  *(Data **)local_d8._M_unused._0_8_ = local_328.first.wp.d;
  if ((QArrayData *)local_328.first.wp.d != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).super___atomic_base<int>.
    _M_i = (((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).
           super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(QObject **)((long)local_d8._M_unused._0_8_ + 8) = local_328.first.wp.value;
  if ((Data *)local_328.first.wp.value == (Data *)0x0) {
    *(void **)((long)local_d8._M_unused._0_8_ + 0x10) =
         local_328.second.super__Function_base._M_functor._M_unused._M_object;
    pcStack_c0 = std::
                 _Function_handler<void_(const_(anonymous_namespace)::Enum1_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                 ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(const_(anonymous_namespace)::Enum1_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    (((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    *(void **)((long)local_d8._M_unused._0_8_ + 0x10) =
         local_328.second.super__Function_base._M_functor._M_unused._M_object;
    pcStack_c0 = std::
                 _Function_handler<void_(const_(anonymous_namespace)::Enum1_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                 ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(const_(anonymous_namespace)::Enum1_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_manager;
    if ((Data *)local_328.first.wp.value != (Data *)0x0) {
      LOCK();
      (((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           (((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
        operator_delete(local_328.first.wp.value,0x10);
      }
    }
  }
  if ((QArrayData *)local_328.first.wp.d != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).super___atomic_base<int>.
    _M_i = (((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).super___atomic_base<int>
        ._M_i == 0) {
      operator_delete(local_328.first.wp.d,0x10);
    }
  }
  QtPromisePrivate::
  PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>::
  addHandler((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
              *)pPVar31,(function<void_(const_(anonymous_namespace)::Enum1_&)> *)&local_d8);
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  if (!bVar24) {
    LOCK();
    (((QSharedData *)&pQVar38->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&pQVar38->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_e8 = (code *)0x0;
  pcStack_e0 = (code *)0x0;
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_f8._M_unused._M_object = operator_new(8);
  *(QObject **)local_f8._M_unused._0_8_ = pQVar38;
  if (bVar24) {
    pcStack_e0 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
                 ::_M_invoke;
    local_e8 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    (((QSharedData *)&pQVar38->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&pQVar38->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pcStack_e0 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
                 ::_M_invoke;
    local_e8 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
               ::_M_manager;
    LOCK();
    (((QSharedData *)&pQVar38->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&pQVar38->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QSharedData *)&pQVar38->field_0x0)->ref).super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(pQVar38,0x10);
    }
  }
  QtPromisePrivate::
  PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>::
  addCatcher((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
              *)pPVar31,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_f8);
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,__destroy_functor);
  }
  if (!bVar24) {
    LOCK();
    (((QSharedData *)&pQVar38->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&pQVar38->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QSharedData *)&pQVar38->field_0x0)->ref).super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(pQVar38,0x10);
    }
  }
  if (PVar17.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar17.m_d.d = *(int *)PVar17.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar17.m_d.d == 0) {
      operator_delete((void *)PVar17.m_d.d,0x10);
    }
  }
  if (resolver_3.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_3.m_d.d = *(int *)resolver_3.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_3.m_d.d == 0) {
      operator_delete((void *)resolver_3.m_d.d,0x10);
    }
  }
  bVar24 = QtPromisePrivate::
           PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
           ::isPending((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                        *)pPVar31);
  if (!bVar24) {
    QtPromisePrivate::
    PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>::
    dispatch((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
              *)pPVar31);
  }
  bVar24 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                     ((PromiseDataBase<void,_void_()> *)this_00);
  while (bVar24 != false) {
    QCoreApplication::processEvents();
    QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
    bVar24 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                       ((PromiseDataBase<void,_void_()> *)this_00);
  }
  LOCK();
  (pQVar64->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar64->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (pQVar64->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar64->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar64->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*(this_00->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])(this_00);
  }
  LOCK();
  (pQVar64->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar64->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar64->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*(this_00->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])(this_00);
  }
  iVar25 = (int)resolver.m_d.d;
  iVar51 = (int)&local_328;
  QByteArray::number(iVar51,(int)resolver.m_d.d);
  pDVar52 = (Data *)local_328.first.wp.value;
  if ((Data *)local_328.first.wp.value == (Data *)0x0) {
    pDVar52 = (Data *)&QByteArray::_empty;
  }
  pcVar33 = (char *)qstrdup((char *)pDVar52);
  if ((QArrayData *)local_328.first.wp.d != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).super___atomic_base<int>.
    _M_i = (((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).super___atomic_base<int>
        ._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_328.first.wp.d,1,8);
    }
  }
  QByteArray::number(iVar51,1);
  pDVar52 = (Data *)local_328.first.wp.value;
  if ((Data *)local_328.first.wp.value == (Data *)0x0) {
    pDVar52 = (Data *)&QByteArray::_empty;
  }
  pcVar34 = (char *)qstrdup((char *)pDVar52);
  if ((QArrayData *)local_328.first.wp.d != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).super___atomic_base<int>.
    _M_i = (((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).super___atomic_base<int>
        ._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_328.first.wp.d,1,8);
    }
  }
  cVar23 = QTest::compare_helper
                     (iVar25 == 1,"Compared values are not the same",pcVar33,pcVar34,
                      "waitForValue(p, Enum1::Value0)","Enum1::Value1",
                      "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                      ,99);
  if (cVar23 == '\0') {
    cVar23 = '\0';
  }
  else {
    bVar24 = QtPromisePrivate::
             PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
             ::isPending((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                          *)pPVar31);
    cVar23 = QTest::qVerify((bool)(~bVar24 &
                                  (pPVar31->
                                  super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                                  ).m_error.m_data._M_exception_object == (void *)0x0),
                            "p.isFulfilled()","",
                            "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                            ,100);
  }
  LOCK();
  (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*(pPVar31->
      super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
      )._vptr_PromiseDataBase[1])(pPVar31);
  }
  if (cVar23 == '\0') {
    return;
  }
  resolver_2.m_d.d._0_4_ = 1;
  QtPromise::resolve<(anonymous_namespace)::Enum1>((QtPromise *)&resolver_3,(Enum1 *)&resolver_2);
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)0x0;
  p.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x0;
  pPStack_2b0 = (PromiseData<(anonymous_namespace)::Enum1> *)
                std::
                _Function_handler<(anonymous_namespace)::Enum2_(const_(anonymous_namespace)::Enum1_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:569:16)>
                ::_M_invoke;
  local_2b8.d = (Data *)std::
                        _Function_handler<(anonymous_namespace)::Enum2_(const_(anonymous_namespace)::Enum1_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:569:16)>
                        ::_M_manager;
  this_01 = (PromiseDataBase<(anonymous_namespace)::Enum2,_void_(const_(anonymous_namespace)::Enum2_&)>
             *)operator_new(0x68);
  this_01->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_01->super_QSharedData = 0;
  (this_01->m_error).m_data._M_exception_object = (void *)0x0;
  this_01[1]._vptr_PromiseDataBase = (_func_int **)0x0;
  (this_01->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->m_catchers).d.size = 0;
  (this_01->m_handlers).d.size = 0;
  (this_01->m_catchers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  *(undefined8 *)&this_01->m_lock = 0;
  *(undefined8 *)&this_01->m_settled = 0;
  *(undefined8 *)&this_01[1].super_QSharedData = 0;
  this_01->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0014f868;
  QReadWriteLock::QReadWriteLock(&this_01->m_lock,0);
  this_01->m_settled = false;
  (this_01->m_handlers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  (this_01->m_handlers).d.size = 0;
  (this_01->m_catchers).d.d = (Data *)0x0;
  (this_01->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->m_catchers).d.size = 0;
  (this_01->m_error).m_data._M_exception_object = (void *)0x0;
  this_01->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseData_0014f800;
  this_01[1]._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_01[1].super_QSharedData = 0;
  LOCK();
  (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar32 = &this_01->super_QSharedData;
  LOCK();
  (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  resolver_4.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum2>::Data>
        )operator_new(0x10);
  (((Data *)resolver_4.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
  super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i = 0;
  ((Data *)resolver_4.m_d.d)->promise = (QPromise<(anonymous_namespace)::Enum2> *)0x0;
  LOCK();
  (((Data *)resolver_4.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
  super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
       (((Data *)resolver_4.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
       super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  puVar35 = (undefined8 *)operator_new(0x10);
  PVar19.m_d.d = resolver_4.m_d.d;
  QVar29.d = QStack_2e0.d;
  puVar35[1] = this_01;
  *puVar35 = &PTR__QPromiseBase_0014f7c8;
  *(undefined8 **)((long)resolver_4.m_d.d + 8) = puVar35;
  LOCK();
  *(int *)resolver_4.m_d.d = *(int *)resolver_4.m_d.d + 1;
  UNLOCK();
  if (resolver_4.m_d.d == (Data *)0x0) {
    LOCK();
    iRam0000000000000000 = iRam0000000000000000 + 1;
    UNLOCK();
    local_328.first.wp.value = (QObject *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_4.m_d.d = *(int *)resolver_4.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver_4.m_d.d = *(int *)resolver_4.m_d.d + 1;
    UNLOCK();
    local_328.first.wp.value = (QObject *)resolver_4.m_d.d;
    LOCK();
    *(int *)resolver_4.m_d.d = *(int *)resolver_4.m_d.d + 1;
    UNLOCK();
  }
  local_328.first.wp.d = (Data *)resolver_4.m_d.d;
  std::function<(anonymous_namespace)::Enum2_(const_(anonymous_namespace)::Enum1_&)>::function
            ((function<(anonymous_namespace)::Enum2_(const_(anonymous_namespace)::Enum1_&)> *)
             &local_328.second,
             (function<(anonymous_namespace)::Enum2_(const_(anonymous_namespace)::Enum1_&)> *)&p);
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  plVar30 = (long *)operator_new(0x30);
  *plVar30 = (long)local_328.first.wp.d;
  if ((Data *)local_328.first.wp.d != (Data *)0x0) {
    LOCK();
    (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  plVar30[1] = (long)local_328.first.wp.value;
  if ((Data *)local_328.first.wp.value != (Data *)0x0) {
    LOCK();
    (((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  std::function<(anonymous_namespace)::Enum2_(const_(anonymous_namespace)::Enum1_&)>::function
            ((function<(anonymous_namespace)::Enum2_(const_(anonymous_namespace)::Enum1_&)> *)
             (plVar30 + 2),
             (function<(anonymous_namespace)::Enum2_(const_(anonymous_namespace)::Enum1_&)> *)
             &local_328.second);
  pcStack_40 = std::
               _Function_handler<void_(const_(anonymous_namespace)::Enum1_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(const_(anonymous_namespace)::Enum1_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
             ::_M_manager;
  local_58._M_unused._M_object = plVar30;
  if (local_328.second.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_328.second.super__Function_base._M_manager)
              ((_Any_data *)&local_328.second,(_Any_data *)&local_328.second,__destroy_functor);
  }
  if ((Data *)local_328.first.wp.value != (Data *)0x0) {
    LOCK();
    (((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_328.first.wp.value,0x10);
    }
  }
  if ((Data *)local_328.first.wp.d != (Data *)0x0) {
    LOCK();
    (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_328.first.wp.d,0x10);
    }
  }
  QtPromisePrivate::
  PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>::
  addHandler(&(QVar29.d)->
              super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
             ,(function<void_(const_(anonymous_namespace)::Enum1_&)> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  QVar29.d = QStack_2e0.d;
  if (PVar19.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar19.m_d.d = *(int *)PVar19.m_d.d + 1;
    UNLOCK();
  }
  local_a8 = (code *)0x0;
  pcStack_a0 = (code *)0x0;
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  local_b8._M_unused._M_object = operator_new(8);
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum2>::Data>
    *)local_b8._M_unused._0_8_)->d = (Data *)PVar19.m_d.d;
  pcVar42 = std::
            _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
            ::_M_manager;
  if (PVar19.m_d.d == (Data *)0x0) {
    pcStack_a0 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
                 ::_M_invoke;
    local_a8 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    *(int *)PVar19.m_d.d = *(int *)PVar19.m_d.d + 1;
    UNLOCK();
    pcStack_a0 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
                 ::_M_invoke;
    local_a8 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
               ::_M_manager;
    LOCK();
    *(int *)PVar19.m_d.d = *(int *)PVar19.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar19.m_d.d == 0) {
      operator_delete((void *)PVar19.m_d.d,0x10);
    }
  }
  QtPromisePrivate::
  PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>::
  addCatcher(&(QVar29.d)->
              super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
             ,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_b8);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  if (PVar19.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar19.m_d.d = *(int *)PVar19.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar19.m_d.d == 0) {
      operator_delete((void *)PVar19.m_d.d,0x10);
    }
  }
  LOCK();
  *(int *)PVar19.m_d.d = *(int *)PVar19.m_d.d + -1;
  UNLOCK();
  if (*(int *)PVar19.m_d.d == 0) {
    operator_delete((void *)PVar19.m_d.d,0x10);
  }
  if (resolver_4.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_4.m_d.d = *(int *)resolver_4.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_4.m_d.d == 0) {
      operator_delete((void *)resolver_4.m_d.d,0x10);
    }
  }
  QVar29.d = QStack_2e0.d;
  bVar24 = QtPromisePrivate::
           PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
           ::isPending(&(QStack_2e0.d)->
                        super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                      );
  if (!bVar24) {
    QtPromisePrivate::
    PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>::
    dispatch(&(QVar29.d)->
              super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
            );
  }
  if (local_2b8.d != (Data *)0x0) {
    (*(code *)local_2b8.d)((_Any_data *)&p,(_Any_data *)&p,__destroy_functor);
  }
  resolver_3.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       &PTR__QPromiseBase_0014f310;
  LOCK();
  pQVar64 = &((QVar29.d)->
             super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
             ).super_QSharedData;
  (pQVar64->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar64->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if (((pQVar64->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i == 0) &&
     (QStack_2e0.d != (PromiseData<(anonymous_namespace)::Enum1> *)0x0)) {
    (**(code **)(((QWeakPointer<QObject> *)
                 &((QStack_2e0.d)->
                  super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                  )._vptr_PromiseDataBase)->d + 8))();
  }
  resolver_2.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum1>::Data>
        )((ulong)resolver_2.m_d.d & 0xffffffff00000000);
  this_02 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  this_02->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_02->super_QSharedData = 0;
  (this_02->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_02->m_catchers).d.size = 0;
  (this_02->m_handlers).d.size = 0;
  (this_02->m_catchers).d.d = (Data *)0x0;
  (this_02->m_handlers).d.d = (Data *)0x0;
  (this_02->m_handlers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  *(undefined8 *)&this_02->m_lock = 0;
  *(undefined8 *)&this_02->m_settled = 0;
  (this_02->m_error).m_data._M_exception_object = (void *)0x0;
  this_02->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_00150568;
  QReadWriteLock::QReadWriteLock(&this_02->m_lock,0);
  this_02->m_settled = false;
  (this_02->m_handlers).d.d = (Data *)0x0;
  (this_02->m_handlers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  (this_02->m_handlers).d.size = 0;
  (this_02->m_catchers).d.d = (Data *)0x0;
  (this_02->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_02->m_catchers).d.size = 0;
  (this_02->m_error).m_data._M_exception_object = (void *)0x0;
  this_02->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_00150500;
  LOCK();
  (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar64 = &this_02->super_QSharedData;
  LOCK();
  (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data>)
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data>)
       local_174._4_8_;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver
            ((PromiseResolver<void> *)&resolver_4,(QPromise<void> *)&resolver);
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data>)
       &PTR__QPromiseBase_001501a0;
  if (this_02 != (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar62 = &this_02->super_QSharedData;
    (pQVar62->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar62->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar62->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (this_02 != (PromiseDataBase<void,_void_()> *)0x0))
    {
      (*this_02->_vptr_PromiseDataBase[1])();
    }
  }
  PVar19.m_d.d = resolver_4.m_d.d;
  if (resolver_4.m_d.d == (Data *)0x0) {
    local_328.first.wp.d = (Data *)0x0;
LAB_0010acba:
    local_328.first.wp.value = (QObject *)0x0;
    local_2f8.d._0_4_ = (int)CONCAT71((int7)((ulong)pcVar42 >> 8),1);
  }
  else {
    LOCK();
    *(int *)resolver_4.m_d.d = *(int *)resolver_4.m_d.d + 1;
    UNLOCK();
    if (resolver_4.m_d.d == (Data *)0x0) {
      local_328.first.wp.d = (Data *)resolver_4.m_d.d;
      LOCK();
      iRam0000000000000000 = iRam0000000000000000 + 1;
      UNLOCK();
      pcVar42 = (code *)0x0;
      goto LAB_0010acba;
    }
    LOCK();
    *(int *)resolver_4.m_d.d = *(int *)resolver_4.m_d.d + 1;
    UNLOCK();
    local_328.first.wp.d = (Data *)resolver_4.m_d.d;
    LOCK();
    *(int *)resolver_4.m_d.d = *(int *)resolver_4.m_d.d + 1;
    UNLOCK();
    local_328.first.wp.value = (QObject *)resolver_4.m_d.d;
    LOCK();
    *(int *)resolver_4.m_d.d = *(int *)resolver_4.m_d.d + 1;
    UNLOCK();
    local_2f8.d = local_2f8.d & 0xffffffff00000000;
  }
  local_328.second.super__Function_base._M_functor._M_unused._M_object = &resolver_2;
  resolver_1.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  local_2f0.d = (Data *)local_328.first.wp.value;
  resolver_1.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       operator_new(0x18);
  *(Data **)resolver_1.m_d.d = local_328.first.wp.d;
  if ((Data *)local_328.first.wp.d != (Data *)0x0) {
    LOCK();
    (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  ((Data *)resolver_1.m_d.d)->promise = (QPromise<int> *)local_328.first.wp.value;
  if ((Data *)local_328.first.wp.value == (Data *)0x0) {
    *(void **)((long)resolver_1.m_d.d + 0x10) =
         local_328.second.super__Function_base._M_functor._M_unused._M_object;
  }
  else {
    LOCK();
    (((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    *(void **)((long)resolver_1.m_d.d + 0x10) =
         local_328.second.super__Function_base._M_functor._M_unused._M_object;
    if ((Data *)local_328.first.wp.value != (Data *)0x0) {
      LOCK();
      (((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           (((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
        operator_delete(local_328.first.wp.value,0x10);
      }
    }
  }
  if ((Data *)local_328.first.wp.d != (Data *)0x0) {
    LOCK();
    (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_328.first.wp.d,0x10);
    }
  }
  QReadWriteLock::lockForWrite();
  local_140 = (QSharedData *)((ulong)&this_01->m_lock | 1);
  pDVar36 = (Data *)QThread::currentThread();
  if (pDVar36 == (Data *)0x0) {
    pDVar37 = (Data *)0x0;
  }
  else {
    pDVar37 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)pDVar36);
  }
  local_2b8.d = (Data *)0x0;
  pPStack_2b0 = (PromiseData<(anonymous_namespace)::Enum1> *)0x0;
  local_2a8 = (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
               *)0x0;
  pfStack_2a0 = (function<void_(const_QtPromisePrivate::PromiseError_&)> *)
                std::
                _Function_handler<void_(const_(anonymous_namespace)::Enum2_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                ::_M_invoke;
  local_2b8 = resolver_1.m_d.d;
  pPStack_2b0 = (PromiseData<(anonymous_namespace)::Enum1> *)0x0;
  local_2a8 = (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
               *)std::
                 _Function_handler<void_(const_(anonymous_namespace)::Enum2_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                 ::_M_manager;
  pPStack_2b0 = (PromiseData<(anonymous_namespace)::Enum1> *)0x0;
  pDVar4 = (this_01->m_handlers).d.d;
  lVar50 = (this_01->m_handlers).d.size;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_0010ae4a:
    p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)0x0;
    p.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x0;
    local_328.second._M_invoker =
         std::
         _Function_handler<void_(const_(anonymous_namespace)::Enum2_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
         ::_M_invoke;
    pfVar48 = &local_328.second;
    local_2a8 = (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
                 *)0x0;
    pfStack_2a0 = (function<void_(const_QtPromisePrivate::PromiseError_&)> *)0x0;
    pfStack_2a0 = (function<void_(const_QtPromisePrivate::PromiseError_&)> *)0x0;
    local_2a8 = (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
                 *)0x0;
    local_328.second.super__Function_base._M_manager =
         std::
         _Function_handler<void_(const_(anonymous_namespace)::Enum2_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
         ::_M_manager;
    local_328.second.super__Function_base._M_functor._M_unused._M_object = (void *)resolver_1.m_d.d;
    local_328.second.super__Function_base._M_functor._8_8_ = 0;
    old = (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>_>
           *)std::
             _Function_handler<void_(const_(anonymous_namespace)::Enum2_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
             ::_M_manager;
    local_328.first.wp.d = (Data *)pDVar37;
    local_328.first.wp.value = (QObject *)pDVar36;
    if ((pDVar4 == (Data *)0x0) ||
       (1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_0010aea0:
      QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>_>
      ::reallocateAndGrow((QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>_>
                           *)&this_01->m_handlers,GrowsAtEnd,(qsizetype)pfVar48,old);
      pPVar28 = (PromiseData<(anonymous_namespace)::Enum1> *)(this_01->m_handlers).d.ptr;
    }
    else {
      pQVar5 = (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>_>
                *)(pDVar4->super_QArrayData).alloc;
      pPVar28 = (PromiseData<(anonymous_namespace)::Enum1> *)(this_01->m_handlers).d.ptr;
      pfVar48 = (function<void_(const_QtPromisePrivate::PromiseError_&)> *)
                ((long)pPVar28 -
                ((ulong)((long)&pDVar4[1].super_QArrayData.flags.i + 3) & 0xfffffffffffffff8));
      lVar45 = (long)pfVar48 >> 4;
      if ((long)pQVar5 + (lVar45 * 0x5555555555555555 - lVar50) < 1) {
        old = pQVar5;
        if (((long)pfVar48 < 1) ||
           (old = (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>_>
                   *)((long)pQVar5 * 2),
           SBORROW8(lVar50 * 3,(long)old) == lVar50 * 3 + (long)pQVar5 * -2 < 0)) goto LAB_0010aea0;
        pPVar31 = (PromiseData<(anonymous_namespace)::Enum1> *)(lVar45 * -0x10 + (long)pPVar28);
        if (pPVar28 != (PromiseData<(anonymous_namespace)::Enum1> *)0x0 && lVar50 != 0) {
          QStack_2e0.d = pPVar31;
          pPVar53 = (PromiseData<(anonymous_namespace)::Enum1> *)
                    ((QWeakPointer<QObject> *)
                     &(pPVar31->
                      super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                      )._vptr_PromiseDataBase + lVar50 * 3);
          local_38 = pPVar28;
          pPVar13 = pPVar53;
          if (pPVar28 < pPVar53) {
            local_38 = pPVar53;
            pPVar13 = pPVar28;
          }
          pPVar63 = pPVar31;
          if (pPVar13 != pPVar31) {
            lVar45 = lVar45 * -0x10;
            do {
              QVar15.ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
              super___atomic_base<int>._M_i =
                   (pPVar28->
                   super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                   ).super_QSharedData.ref;
              uVar27 = *(undefined4 *)
                        &(pPVar28->
                         super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                         ).field_0xc;
              pPVar63 = (PromiseData<(anonymous_namespace)::Enum1> *)((long)pPVar28 + lVar45);
              ((QWeakPointer<QObject> *)
              &(pPVar63->
               super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
               )._vptr_PromiseDataBase)->d =
                   ((QWeakPointer<QObject> *)
                   &(pPVar28->
                    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                    )._vptr_PromiseDataBase)->d;
              (pPVar63->
              super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
              ).super_QSharedData =
                   (QSharedData)
                   QVar15.ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                   super___atomic_base<int>._M_i;
              *(undefined4 *)
               &(pPVar63->
                super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                ).field_0xc = uVar27;
              ((QWeakPointer<QObject> *)
              &(pPVar28->
               super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
               )._vptr_PromiseDataBase)->d = (Data *)0x0;
              *(QObject **)
               &(pPVar28->
                super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                ).super_QSharedData = (QObject *)0x0;
              puVar35 = (undefined8 *)((long)pPVar28 + lVar45 + 0x10);
              *puVar35 = 0;
              puVar35[1] = 0;
              *(undefined8 *)((long)pPVar28 + lVar45 + 0x20) = 0;
              *(pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> **)
               ((long)pPVar28 + lVar45 + 0x28) =
                   (pPVar28->
                   super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                   ).m_handlers.d.ptr;
              if ((pPVar28->
                  super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                  ).m_handlers.d.d != (Data *)0x0) {
                uVar12 = *(undefined8 *)
                          &(pPVar28->
                           super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                           ).m_settled;
                *(undefined8 *)((long)pPVar28 + lVar45 + 0x10) =
                     *(undefined8 *)
                      &(((function<void_(const_(anonymous_namespace)::Enum2_&)> *)
                        &(pPVar28->
                         super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                         ).m_lock)->super__Function_base)._M_functor;
                *(undefined8 *)((long)pPVar28 + lVar45 + 0x18) = uVar12;
                *(Data **)((long)pPVar28 + lVar45 + 0x20) =
                     (pPVar28->
                     super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                     ).m_handlers.d.d;
                (pPVar28->
                super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                ).m_handlers.d.d = (Data *)0x0;
                (pPVar28->
                super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                ).m_handlers.d.ptr =
                     (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
              }
              pPVar44 = (PromiseData<(anonymous_namespace)::Enum1> *)((long)pPVar28 + lVar45 + 0x30)
              ;
              pPVar28 = (PromiseData<(anonymous_namespace)::Enum1> *)
                        &(pPVar28->
                         super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                         ).m_handlers.d.size;
              pPVar63 = pPVar13;
            } while (pPVar44 != pPVar13);
          }
          resolver_3.m_d.d =
               (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
               &local_2d8;
          local_2d8 = pPVar63;
          pPVar13 = local_38;
          for (; local_38 = pPVar13, pPVar63 != pPVar53;
              pPVar63 = (PromiseData<(anonymous_namespace)::Enum1> *)
                        &(pPVar63->
                         super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                         ).m_handlers.d.size) {
            std::
            pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>::
            operator=((pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>
                       *)pPVar63,(type)pPVar28);
            pPVar28 = (PromiseData<(anonymous_namespace)::Enum1> *)
                      &(pPVar28->
                       super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                       ).m_handlers.d.size;
            pPVar13 = local_38;
          }
          resolver_3.m_d.d =
               (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
               &QStack_2e0;
          while (pPVar28 != pPVar13) {
            pcVar42 = (code *)pPVar28[-1].m_value.m_data.
                              super___shared_ptr<(anonymous_namespace)::Enum1,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr;
            if (pcVar42 != (code *)0x0) {
              pqVar2 = &pPVar28[-1].
                        super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                        .m_catchers.d.size;
              (*pcVar42)((_Any_data *)pqVar2,(_Any_data *)pqVar2,__destroy_functor);
            }
            pPVar28 = (PromiseData<(anonymous_namespace)::Enum1> *)
                      &pPVar28[-1].
                       super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                       .m_catchers;
            pDVar57 = (((QVector<Catcher> *)pPVar28)->d).d;
            if (pDVar57 != (Data *)0x0) {
              LOCK();
              (pDVar57->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   (pDVar57->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pDVar57->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                pDVar57 = (((QVector<Catcher> *)pPVar28)->d).d;
                if (pDVar57 == (Data *)0x0) {
                  pDVar57 = (Data *)0x0;
                }
                operator_delete(pDVar57);
              }
            }
          }
          QVar29.d = *(PromiseData<(anonymous_namespace)::Enum1> **)resolver_3.m_d.d;
          if (QVar29.d != QStack_2e0.d) {
            bVar24 = QVar29.d < QStack_2e0.d;
            do {
              *(QWeakPointer<QObject> **)resolver_3.m_d.d =
                   (QWeakPointer<QObject> *)
                   &((QVar29.d)->
                    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                    )._vptr_PromiseDataBase + ((ulong)bVar24 - 1 | 1) * 3;
              plVar30 = *(long **)resolver_3.m_d.d;
              if ((code *)plVar30[4] != (code *)0x0) {
                (*(code *)plVar30[4])(plVar30 + 2,plVar30 + 2,3);
              }
              piVar11 = (int *)*plVar30;
              if (piVar11 != (int *)0x0) {
                LOCK();
                *piVar11 = *piVar11 + -1;
                UNLOCK();
                if (*piVar11 == 0) {
                  pvVar58 = (void *)*plVar30;
                  if (pvVar58 == (void *)0x0) {
                    pvVar58 = (void *)0x0;
                  }
                  operator_delete(pvVar58);
                }
              }
              QVar29.d = *(PromiseData<(anonymous_namespace)::Enum1> **)resolver_3.m_d.d;
            } while (QVar29.d != QStack_2e0.d);
          }
        }
        (this_01->m_handlers).d.ptr =
             (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)pPVar31;
        pPVar28 = pPVar31;
      }
    }
    lVar45 = (this_01->m_handlers).d.size;
    pQVar3 = (QWeakPointer<QObject> *)
             &(pPVar28->
              super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
              )._vptr_PromiseDataBase + lVar45 * 3;
    lVar43 = lVar45 - lVar50;
    if (lVar43 < 1) {
      pQVar3->d = local_328.first.wp.d;
      pQVar3->value = local_328.first.wp.value;
      local_328.first.wp.d = (Data *)0x0;
      local_328.first.wp.value = (QObject *)0x0;
      pQVar3[1].d = 0;
      *(undefined8 *)((long)(pQVar3 + 1) + 8) = 0;
      pQVar3[2].d = 0;
      *(_Invoker_type *)((long)(pQVar3 + 2) + 8) = local_328.second._M_invoker;
      if (local_328.second.super__Function_base._M_manager != (_Manager_type)0x0) {
        pQVar3[1].d = local_328.second.super__Function_base._M_functor._M_unused._M_object;
        *(undefined8 *)((long)(pQVar3 + 1) + 8) =
             local_328.second.super__Function_base._M_functor._8_8_;
        *(_Manager_type *)(pQVar3 + 2) = local_328.second.super__Function_base._M_manager;
        local_328.second.super__Function_base._M_manager = (_Manager_type)0x0;
        local_328.second._M_invoker = (_Invoker_type)0x0;
      }
      (this_01->m_handlers).d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)pPVar28;
      (this_01->m_handlers).d.size = lVar45 + 1;
    }
    else {
      this_06 = (pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>
                 *)((long)pPVar28 + lVar45 * 0x30 + -0x30);
      pQVar38 = *(QObject **)((long)(pQVar3 + -3) + 8);
      pQVar3->d = pQVar3[-3].d;
      pQVar3->value = pQVar38;
      (this_06->first).wp.d = (Data *)0x0;
      *(undefined8 *)((long)pPVar28 + lVar45 * 0x30 + -0x28) = 0;
      pQVar3[1].d = 0;
      *(undefined8 *)((long)(pQVar3 + 1) + 8) = 0;
      pQVar3[2].d = 0;
      lVar6 = *(long *)(pQVar3 + -1);
      *(undefined8 *)((long)(pQVar3 + 2) + 8) = *(undefined8 *)((long)(pQVar3 + -1) + 8);
      if (lVar6 != 0) {
        uVar12 = *(undefined8 *)((long)(pQVar3 + -2) + 8);
        pQVar3[1].d = pQVar3[-2].d;
        *(undefined8 *)((long)(pQVar3 + 1) + 8) = uVar12;
        *(long *)(pQVar3 + 2) = lVar6;
        pQVar3[-1].d = 0;
        *(undefined8 *)((long)(pQVar3 + -1) + 8) = 0;
      }
      if (lVar43 != 1) {
        lVar43 = 1 - lVar43;
        do {
          std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>
          ::operator=(this_06,this_06 + -1);
          lVar43 = lVar43 + 1;
          this_06 = this_06 + -1;
        } while (lVar43 != 0);
      }
      std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>::
      operator=((pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>
                 *)((QWeakPointer<QObject> *)
                    &(pPVar28->
                     super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                     )._vptr_PromiseDataBase + lVar50 * 3),(type)&local_328);
      (this_01->m_handlers).d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)pPVar28;
      (this_01->m_handlers).d.size = lVar45 + 1;
      if (local_328.second.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_328.second.super__Function_base._M_manager)
                  ((_Any_data *)&local_328.second,(_Any_data *)&local_328.second,__destroy_functor);
      }
    }
    if ((Data *)local_328.first.wp.d != (Data *)0x0) {
      LOCK();
      (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
        pDVar36 = (Data *)local_328.first.wp.d;
        if ((Data *)local_328.first.wp.d == (Data *)0x0) {
          pDVar36 = (Data *)0x0;
        }
        operator_delete(pDVar36);
      }
    }
    if (local_2a8 !=
        (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
         *)0x0) {
      (*(code *)local_2a8)(&local_2b8,&local_2b8,3);
    }
  }
  else {
    ppVar8 = (this_01->m_handlers).d.ptr;
    ppVar60 = (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)
              ((ulong)((long)&pDVar4[1].super_QArrayData.flags.i + 3U) & 0xfffffffffffffff8);
    if ((pDVar4->super_QArrayData).alloc - lVar50 ==
        ((long)ppVar8 - (long)ppVar60 >> 4) * -0x5555555555555555) {
      if ((lVar50 != 0) || (ppVar60 == ppVar8)) goto LAB_0010ae4a;
      ppVar8[-1].first.wp.d = (Data *)pDVar37;
      ppVar8[-1].first.wp.value = (QObject *)pDVar36;
      *(undefined8 *)&ppVar8[-1].second.super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&ppVar8[-1].second.super__Function_base._M_functor + 8) = 0;
      ppVar8[-1].second.super__Function_base._M_manager = (_Manager_type)0x0;
      ppVar8[-1].second._M_invoker =
           std::
           _Function_handler<void_(const_(anonymous_namespace)::Enum2_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
           ::_M_invoke;
      *(QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
       &ppVar8[-1].second.super__Function_base._M_functor = resolver_1.m_d.d;
      *(undefined8 *)((long)&ppVar8[-1].second.super__Function_base._M_functor + 8) = 0;
      ppVar8[-1].second.super__Function_base._M_manager =
           std::
           _Function_handler<void_(const_(anonymous_namespace)::Enum2_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
           ::_M_manager;
      pppVar1 = &(this_01->m_handlers).d.ptr;
      *pppVar1 = *pppVar1 + -1;
    }
    else {
      ppVar8[lVar50].first.wp.d = (Data *)pDVar37;
      ppVar8[lVar50].first.wp.value = (QObject *)pDVar36;
      *(undefined8 *)&ppVar8[lVar50].second.super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&ppVar8[lVar50].second.super__Function_base._M_functor + 8) = 0;
      ppVar8[lVar50].second.super__Function_base._M_manager = (_Manager_type)0x0;
      ppVar8[lVar50].second._M_invoker =
           std::
           _Function_handler<void_(const_(anonymous_namespace)::Enum2_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
           ::_M_invoke;
      *(QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
       &ppVar8[lVar50].second.super__Function_base._M_functor = resolver_1.m_d.d;
      *(undefined8 *)((long)&ppVar8[lVar50].second.super__Function_base._M_functor + 8) = 0;
      ppVar8[lVar50].second.super__Function_base._M_manager =
           std::
           _Function_handler<void_(const_(anonymous_namespace)::Enum2_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
           ::_M_manager;
    }
    pfStack_2a0 = (function<void_(const_QtPromisePrivate::PromiseError_&)> *)0x0;
    local_2a8 = (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
                 *)0x0;
    p.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x0;
    p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)0x0;
    pqVar2 = &(this_01->m_handlers).d.size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (p.super_QPromiseBase<int>._vptr_QPromiseBase != (_func_int **)0x0) {
    LOCK();
    *(int *)p.super_QPromiseBase<int>._vptr_QPromiseBase =
         *(int *)p.super_QPromiseBase<int>._vptr_QPromiseBase + -1;
    UNLOCK();
    if (*(int *)p.super_QPromiseBase<int>._vptr_QPromiseBase == 0) {
      pp_Var56 = p.super_QPromiseBase<int>._vptr_QPromiseBase;
      if (p.super_QPromiseBase<int>._vptr_QPromiseBase == (_func_int **)0x0) {
        pp_Var56 = (_func_int **)0x0;
      }
      operator_delete(pp_Var56);
    }
  }
  QReadWriteLock::unlock();
  if ((char)local_2f8.d == '\0') {
    LOCK();
    ((local_2f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_2f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_158 = (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
               *)0x0;
  pfStack_150 = (function<void_(const_QtPromisePrivate::PromiseError_&)> *)0x0;
  local_168 = (undefined8 *)0x0;
  uStack_160 = 0;
  local_168 = (undefined8 *)operator_new(8);
  *local_168 = local_2f0.d;
  if ((char)local_2f8.d == '\0') {
    LOCK();
    ((local_2f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_2f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pfStack_150 = (function<void_(const_QtPromisePrivate::PromiseError_&)> *)
                  std::
                  _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
                  ::_M_invoke;
    local_158 = (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
                 *)std::
                   _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
                   ::_M_manager;
    LOCK();
    ((local_2f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_2f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_2f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_2f0.d,0x10);
    }
  }
  else {
    pfStack_150 = (function<void_(const_QtPromisePrivate::PromiseError_&)> *)
                  std::
                  _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
                  ::_M_invoke;
    local_158 = (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
                 *)std::
                   _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
                   ::_M_manager;
  }
  QReadWriteLock::lockForWrite();
  pQVar62 = local_140;
  pQVar38 = (QObject *)QThread::currentThread();
  if (pQVar38 == (QObject *)0x0) {
    local_328.first.wp.d = (Data *)0x0;
  }
  else {
    local_328.first.wp.d = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar38);
  }
  local_328.second.super__Function_base._M_functor._M_unused._M_object = (undefined8 *)0x0;
  local_328.second.super__Function_base._M_functor._8_8_ = 0;
  local_328.second.super__Function_base._M_manager = (_Manager_type)0x0;
  local_328.second._M_invoker = (_Invoker_type)pfStack_150;
  if (local_158 !=
      (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
       *)0x0) {
    local_328.second.super__Function_base._M_functor._M_unused._M_object = local_168;
    local_328.second.super__Function_base._M_functor._8_8_ = uStack_160;
    local_328.second.super__Function_base._M_manager = (_Manager_type)local_158;
    local_158 = (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
                 *)0x0;
    pfStack_150 = (function<void_(const_QtPromisePrivate::PromiseError_&)> *)0x0;
  }
  local_328.first.wp.value = pQVar38;
  QtPrivate::
  QGenericArrayOps<std::pair<QPointer<QThread>,std::function<void(QtPromisePrivate::PromiseError_const&)>>>
  ::emplace<std::pair<QPointer<QThread>,std::function<void(QtPromisePrivate::PromiseError_const&)>>>
            ((QGenericArrayOps<std::pair<QPointer<QThread>,std::function<void(QtPromisePrivate::PromiseError_const&)>>>
              *)&this_01->m_catchers,(this_01->m_catchers).d.size,&local_328);
  if ((QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
       *)local_328.second.super__Function_base._M_manager !=
      (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
       *)0x0) {
    (*local_328.second.super__Function_base._M_manager)(&local_328.second,&local_328.second,3);
  }
  if ((QArrayData *)local_328.first.wp.d != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).super___atomic_base<int>.
    _M_i = (((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).super___atomic_base<int>
        ._M_i == 0) {
      pQVar54 = (QArrayData *)local_328.first.wp.d;
      if ((QArrayData *)local_328.first.wp.d == (QArrayData *)0x0) {
        pQVar54 = (QArrayData *)0x0;
      }
      operator_delete(pQVar54);
    }
  }
  if (((ulong)pQVar62 & 1) != 0) {
    QReadWriteLock::unlock();
  }
  if (local_158 !=
      (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
       *)0x0) {
    (*(code *)local_158)(&local_168,&local_168,3);
  }
  if ((char)local_2f8.d == '\0') {
    LOCK();
    ((local_2f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_2f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_2f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_2f0.d,0x10);
    }
  }
  if (PVar19.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar19.m_d.d = *(int *)PVar19.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar19.m_d.d == 0) {
      operator_delete((void *)PVar19.m_d.d,0x10);
    }
  }
  if (resolver_4.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_4.m_d.d = *(int *)resolver_4.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_4.m_d.d == 0) {
      operator_delete((void *)resolver_4.m_d.d,0x10);
    }
  }
  bVar24 = QtPromisePrivate::
           PromiseDataBase<(anonymous_namespace)::Enum2,_void_(const_(anonymous_namespace)::Enum2_&)>
           ::isPending(this_01);
  if (!bVar24) {
    QtPromisePrivate::
    PromiseDataBase<(anonymous_namespace)::Enum2,_void_(const_(anonymous_namespace)::Enum2_&)>::
    dispatch(this_01);
  }
  bVar24 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_02);
  while (bVar24 != false) {
    QCoreApplication::processEvents();
    QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
    bVar24 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_02);
  }
  LOCK();
  (pQVar64->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar64->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (pQVar64->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar64->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar64->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_02->_vptr_PromiseDataBase[1])(this_02);
  }
  LOCK();
  (pQVar64->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar64->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar64->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_02->_vptr_PromiseDataBase[1])(this_02);
  }
  iVar25 = (int)resolver_2.m_d.d;
  QByteArray::number(iVar51,(int)resolver_2.m_d.d);
  pQVar38 = local_328.first.wp.value;
  if (local_328.first.wp.value == (QObject *)0x0) {
    pQVar38 = (QObject *)&QByteArray::_empty;
  }
  pcVar33 = (char *)qstrdup((char *)pQVar38);
  if ((QArrayData *)local_328.first.wp.d != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).super___atomic_base<int>.
    _M_i = (((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).super___atomic_base<int>
        ._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_328.first.wp.d,1,8);
    }
  }
  QByteArray::number(iVar51,1);
  pQVar38 = local_328.first.wp.value;
  if (local_328.first.wp.value == (QObject *)0x0) {
    pQVar38 = (QObject *)&QByteArray::_empty;
  }
  pcVar34 = (char *)qstrdup((char *)pQVar38);
  if ((QArrayData *)local_328.first.wp.d != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).super___atomic_base<int>.
    _M_i = (((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).super___atomic_base<int>
        ._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_328.first.wp.d,1,8);
    }
  }
  cVar23 = QTest::compare_helper
                     (iVar25 == 1,"Compared values are not the same",pcVar33,pcVar34,
                      "waitForValue(p, Enum2::Value0)","Enum2::Value1",
                      "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                      ,0x6d);
  if (cVar23 == '\0') {
    cVar23 = '\0';
  }
  else {
    bVar24 = QtPromisePrivate::
             PromiseDataBase<(anonymous_namespace)::Enum2,_void_(const_(anonymous_namespace)::Enum2_&)>
             ::isPending(this_01);
    cVar23 = QTest::qVerify((bool)(~bVar24 &
                                  (this_01->m_error).m_data._M_exception_object == (void *)0x0),
                            "p.isFulfilled()","",
                            "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                            ,0x6e);
  }
  LOCK();
  (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_01->_vptr_PromiseDataBase[1])(this_01);
  }
  if (cVar23 == '\0') {
    return;
  }
  QByteArray::QByteArray((QByteArray *)&local_328,"foo",-1);
  resolver_3.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       &PTR__QPromiseBase_00150140;
  pPVar28 = (PromiseData<(anonymous_namespace)::Enum1> *)operator_new(0x68);
  ((PromiseDataBase<int,_void_(const_int_&)> *)
  &pPVar28->
   super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>)
  ->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)
   &((PromiseDataBase<int,_void_(const_int_&)> *)
    &pPVar28->
     super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
    )->super_QSharedData = 0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar28->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_error).m_data._M_exception_object = (void *)0x0;
  (pPVar28->m_value).m_data.
  super___shared_ptr<(anonymous_namespace)::Enum1,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar28->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar28->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_catchers).d.size = 0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar28->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_handlers).d.size = 0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar28->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_catchers).d.d = (Data *)0x0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar28->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_handlers).d.d = (Data *)0x0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar28->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  *(undefined8 *)
   &((PromiseDataBase<int,_void_(const_int_&)> *)
    &pPVar28->
     super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
    )->m_lock = 0;
  *(undefined8 *)
   &((PromiseDataBase<int,_void_(const_int_&)> *)
    &pPVar28->
     super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
    )->m_settled = 0;
  (pPVar28->m_value).m_data.
  super___shared_ptr<(anonymous_namespace)::Enum1,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ((PromiseDataBase<int,_void_(const_int_&)> *)
  &pPVar28->
   super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>)
  ->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_00150640;
  QReadWriteLock::QReadWriteLock
            (&((PromiseDataBase<int,_void_(const_int_&)> *)
              &pPVar28->
               super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
              )->m_lock,0);
  ((PromiseDataBase<int,_void_(const_int_&)> *)
  &pPVar28->
   super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>)
  ->m_settled = false;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar28->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_handlers).d.d = (Data *)0x0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar28->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar28->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_handlers).d.size = 0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar28->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_catchers).d.d = (Data *)0x0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar28->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar28->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_catchers).d.size = 0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar28->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_error).m_data._M_exception_object = (void *)0x0;
  ((PromiseDataBase<int,_void_(const_int_&)> *)
  &pPVar28->
   super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>)
  ->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseData_001505d8;
  (pPVar28->m_value).m_data.
  super___shared_ptr<(anonymous_namespace)::Enum1,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar28->m_value).m_data.
  super___shared_ptr<(anonymous_namespace)::Enum1,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LOCK();
  pQVar32 = &((PromiseDataBase<int,_void_(const_int_&)> *)
             &pPVar28->
              super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
             )->super_QSharedData;
  (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar28 != (PromiseData<(anonymous_namespace)::Enum1> *)0x0) {
    LOCK();
    pQVar32 = &((PromiseDataBase<int,_void_(const_int_&)> *)
               &pPVar28->
                super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
               )->super_QSharedData;
    (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001505a0;
  QStack_2e0.d = pPVar28;
  p.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)pPVar28;
  QtPromisePrivate::PromiseResolver<QByteArray>::PromiseResolver
            ((PromiseResolver<QByteArray> *)&resolver_4,(QPromise<QByteArray> *)&p);
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00150140;
  if (p.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar32 = &((p.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
               super_QSharedData;
    (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((p.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  if (resolver_4.m_d.d == (Data *)0x0) {
    resolver_2.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum1>::Data>
          )(Data *)0x0;
LAB_0010b7bf:
    bVar24 = true;
    QVar39.d = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_4.m_d.d = *(int *)resolver_4.m_d.d + 1;
    UNLOCK();
    resolver_2.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum1>::Data>
          )(QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum1>::Data>
            )resolver_4.m_d.d;
    if (resolver_4.m_d.d == (Data *)0x0) goto LAB_0010b7bf;
    LOCK();
    *(int *)resolver_4.m_d.d = *(int *)resolver_4.m_d.d + 1;
    UNLOCK();
    bVar24 = false;
    QVar39 = resolver_4.m_d.d;
  }
  QtPromisePrivate::PromiseResolver<QByteArray>::resolve<QByteArray>
            ((PromiseResolver<QByteArray> *)&resolver_2,(QByteArray *)&local_328);
  if (!bVar24) {
    LOCK();
    ((QVar39.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar39.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QVar39.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
        ._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(QVar39.d,0x10);
    }
  }
  if (resolver_2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_2.m_d.d == 0) {
      operator_delete((void *)resolver_2.m_d.d,0x10);
    }
  }
  if (resolver_4.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_4.m_d.d = *(int *)resolver_4.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_4.m_d.d == 0) {
      operator_delete((void *)resolver_4.m_d.d,0x10);
    }
  }
  resolver_3.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       &PTR__QPromiseBase_001505a0;
  QtPromise::QPromise<QByteArray>::convert<QString>((QPromise<QByteArray> *)&resolver);
  resolver_3.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       &PTR__QPromiseBase_00150140;
  if (QStack_2e0.d != (PromiseData<(anonymous_namespace)::Enum1> *)0x0) {
    LOCK();
    pQVar32 = &((PromiseDataBase<int,_void_(const_int_&)> *)
               &(QStack_2e0.d)->
                super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
               )->super_QSharedData;
    (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (QStack_2e0.d != (PromiseData<(anonymous_namespace)::Enum1> *)0x0)) {
      (*((PromiseDataBase<int,_void_(const_int_&)> *)
        &(QStack_2e0.d)->
         super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
        )->_vptr_PromiseDataBase[1])();
    }
  }
  if ((QArrayData *)local_328.first.wp.d != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).super___atomic_base<int>.
    _M_i = (((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).super___atomic_base<int>
        ._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_328.first.wp.d,1,8);
    }
  }
  resolver_3.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  QStack_2e0.d = (PromiseData<(anonymous_namespace)::Enum1> *)0x0;
  local_2d8 = (PromiseData<(anonymous_namespace)::Enum1> *)0x0;
  waitForValue<QString>((QString *)&p,(QPromise<QString> *)&resolver,(QString *)&resolver_3);
  QVar65.m_data = (storage_type *)((long)&iRam0000000000000000 + 3);
  QVar65.m_size = (qsizetype)&local_328;
  QString::fromUtf8(QVar65);
  pDVar59 = local_328.first.wp.d;
  QVar66.m_data = (storage_type_conflict *)p.super_QPromiseBase<int>.m_d.d;
  QVar66.m_size = (qsizetype)local_2b8.d;
  QVar69.m_data = (storage_type_conflict *)local_328.first.wp.value;
  QVar69.m_size = local_328.second.super__Function_base._M_functor._M_unused._0_8_;
  cVar23 = QTest::qCompare(QVar66,QVar69,"waitForValue(p, QString{})","QString{\"foo\"}",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                           ,0x78);
  if ((QArrayData *)pDVar59 != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&pDVar59->field_0x0)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)&pDVar59->field_0x0)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)&pDVar59->field_0x0)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)pDVar59,2,8);
    }
  }
  if (p.super_QPromiseBase<int>._vptr_QPromiseBase != (_func_int **)0x0) {
    LOCK();
    *(int *)p.super_QPromiseBase<int>._vptr_QPromiseBase =
         *(int *)p.super_QPromiseBase<int>._vptr_QPromiseBase + -1;
    UNLOCK();
    if (*(int *)p.super_QPromiseBase<int>._vptr_QPromiseBase == 0) {
      QArrayData::deallocate((QArrayData *)p.super_QPromiseBase<int>._vptr_QPromiseBase,2,8);
    }
  }
  if (resolver_3.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_3.m_d.d = *(int *)resolver_3.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_3.m_d.d == 0) {
      QArrayData::deallocate((QArrayData *)resolver_3.m_d.d,2,8);
    }
  }
  if (cVar23 == '\0') {
    cVar23 = '\0';
  }
  else {
    bVar24 = QtPromisePrivate::PromiseDataBase<QString,_void_(const_QString_&)>::isPending
                       ((PromiseDataBase<QString,_void_(const_QString_&)> *)this_02);
    cVar23 = QTest::qVerify((bool)(~bVar24 &
                                  (this_02->m_error).m_data._M_exception_object == (void *)0x0),
                            "p.isFulfilled()","",
                            "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                            ,0x79);
  }
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data>)
       &PTR__QPromiseBase_00150170;
  if (this_02 != (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar32 = &this_02->super_QSharedData;
    (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (this_02 != (PromiseDataBase<void,_void_()> *)0x0))
    {
      (*this_02->_vptr_PromiseDataBase[1])();
    }
  }
  if (cVar23 == '\0') {
    return;
  }
  p_3.super_QPromiseBase<QString>._vptr_QPromiseBase =
       (_func_int **)CONCAT44(p_3.super_QPromiseBase<QString>._vptr_QPromiseBase._4_4_,0x2a);
  QtPromise::resolve<(anonymous_namespace)::Foo>((QtPromise *)&resolver_3,(Foo *)&p_3);
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)0x0;
  p.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x0;
  pPStack_2b0 = (PromiseData<(anonymous_namespace)::Enum1> *)
                std::
                _Function_handler<(anonymous_namespace)::Bar_(const_(anonymous_namespace)::Foo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:569:16)>
                ::_M_invoke;
  local_2b8.d = (Data *)std::
                        _Function_handler<(anonymous_namespace)::Bar_(const_(anonymous_namespace)::Foo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:569:16)>
                        ::_M_manager;
  this_03 = (PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
             *)operator_new(0x68);
  this_03->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_03->super_QSharedData = 0;
  (this_03->m_error).m_data._M_exception_object = (void *)0x0;
  this_03[1]._vptr_PromiseDataBase = (_func_int **)0x0;
  (this_03->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_03->m_catchers).d.size = 0;
  (this_03->m_handlers).d.size = 0;
  (this_03->m_catchers).d.d = (Data *)0x0;
  (this_03->m_handlers).d.d = (Data *)0x0;
  (this_03->m_handlers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  *(undefined8 *)&this_03->m_lock = 0;
  *(undefined8 *)&this_03->m_settled = 0;
  *(undefined8 *)&this_03[1].super_QSharedData = 0;
  this_03->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0014fd38;
  QReadWriteLock::QReadWriteLock(&this_03->m_lock,0);
  this_03->m_settled = false;
  (this_03->m_handlers).d.d = (Data *)0x0;
  (this_03->m_handlers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  (this_03->m_handlers).d.size = 0;
  (this_03->m_catchers).d.d = (Data *)0x0;
  (this_03->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_03->m_catchers).d.size = 0;
  (this_03->m_error).m_data._M_exception_object = (void *)0x0;
  this_03->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseData_0014fcd0;
  this_03[1]._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_03[1].super_QSharedData = 0;
  LOCK();
  (this_03->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_03->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar32 = &this_03->super_QSharedData;
  LOCK();
  (this_03->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_03->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  resolver_7.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Bar>::Data>
        )operator_new(0x10);
  (((Data *)resolver_7.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
  super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i = 0;
  ((Data *)resolver_7.m_d.d)->promise = (QPromise<(anonymous_namespace)::Bar> *)0x0;
  LOCK();
  (((Data *)resolver_7.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
  super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
       (((Data *)resolver_7.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
       super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  puVar35 = (undefined8 *)operator_new(0x10);
  PVar21.m_d.d = resolver_7.m_d.d;
  QVar29.d = QStack_2e0.d;
  puVar35[1] = this_03;
  *puVar35 = &PTR__QPromiseBase_0014fc98;
  *(undefined8 **)((long)resolver_7.m_d.d + 8) = puVar35;
  LOCK();
  *(int *)resolver_7.m_d.d = *(int *)resolver_7.m_d.d + 1;
  UNLOCK();
  if (resolver_7.m_d.d == (Data *)0x0) {
    LOCK();
    iRam0000000000000000 = iRam0000000000000000 + 1;
    UNLOCK();
    local_328.first.wp.value = (QObject *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_7.m_d.d = *(int *)resolver_7.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver_7.m_d.d = *(int *)resolver_7.m_d.d + 1;
    UNLOCK();
    local_328.first.wp.value = (QObject *)resolver_7.m_d.d;
    LOCK();
    *(int *)resolver_7.m_d.d = *(int *)resolver_7.m_d.d + 1;
    UNLOCK();
  }
  local_328.first.wp.d = (Data *)resolver_7.m_d.d;
  std::function<(anonymous_namespace)::Bar_(const_(anonymous_namespace)::Foo_&)>::function
            ((function<(anonymous_namespace)::Bar_(const_(anonymous_namespace)::Foo_&)> *)
             &local_328.second,
             (function<(anonymous_namespace)::Bar_(const_(anonymous_namespace)::Foo_&)> *)&p);
  resolver_4.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum2>::Data>
        )(Data *)0x0;
  QVar39.d = (Data *)operator_new(0x30);
  *(Data **)QVar39.d = local_328.first.wp.d;
  if ((Data *)local_328.first.wp.d != (Data *)0x0) {
    LOCK();
    (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  (QVar39.d)->promise = (QPromise<(anonymous_namespace)::Enum2> *)local_328.first.wp.value;
  if ((Data *)local_328.first.wp.value != (Data *)0x0) {
    LOCK();
    *(int *)&((QPromiseBase<(anonymous_namespace)::Enum2> *)&(local_328.first.wp.value)->field_0x0)
             ->_vptr_QPromiseBase =
         *(int *)&((QPromiseBase<(anonymous_namespace)::Enum2> *)
                  &(local_328.first.wp.value)->field_0x0)->_vptr_QPromiseBase + 1;
    UNLOCK();
  }
  std::function<(anonymous_namespace)::Bar_(const_(anonymous_namespace)::Foo_&)>::function
            ((function<(anonymous_namespace)::Bar_(const_(anonymous_namespace)::Foo_&)> *)
             (QVar39.d + 1),
             (function<(anonymous_namespace)::Bar_(const_(anonymous_namespace)::Foo_&)> *)
             &local_328.second);
  resolver_4.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum2>::Data>
        )(QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum2>::Data>
          )QVar39.d;
  if ((QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
       *)local_328.second.super__Function_base._M_manager !=
      (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
       *)0x0) {
    (*local_328.second.super__Function_base._M_manager)(&local_328.second,&local_328.second,3);
  }
  if ((Data *)local_328.first.wp.value != (Data *)0x0) {
    LOCK();
    *(int *)&((QPromiseBase<(anonymous_namespace)::Enum2> *)&(local_328.first.wp.value)->field_0x0)
             ->_vptr_QPromiseBase =
         *(int *)&((QPromiseBase<(anonymous_namespace)::Enum2> *)
                  &(local_328.first.wp.value)->field_0x0)->_vptr_QPromiseBase + -1;
    UNLOCK();
    if (*(int *)&((QPromiseBase<(anonymous_namespace)::Enum2> *)
                 &(local_328.first.wp.value)->field_0x0)->_vptr_QPromiseBase == 0) {
      operator_delete(local_328.first.wp.value,0x10);
    }
  }
  if ((Data *)local_328.first.wp.d != (Data *)0x0) {
    LOCK();
    (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_328.first.wp.d,0x10);
    }
  }
  QtPromisePrivate::
  PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>::addHandler
            ((PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>
              *)QVar29.d,(function<void_(const_(anonymous_namespace)::Foo_&)> *)&resolver_4);
  std::
  _Function_handler<void_(const_(anonymous_namespace)::Foo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
  ::_M_manager((_Any_data *)&resolver_4,(_Any_data *)&resolver_4,__destroy_functor);
  QVar29.d = QStack_2e0.d;
  if (PVar21.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar21.m_d.d = *(int *)PVar21.m_d.d + 1;
    UNLOCK();
  }
  resolver_2.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum1>::Data>
        )(Data *)0x0;
  resolver_2.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum1>::Data>
        )operator_new(8);
  *(QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Bar>::Data>
    *)resolver_2.m_d.d = PVar21.m_d.d;
  if (PVar21.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar21.m_d.d = *(int *)PVar21.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)PVar21.m_d.d = *(int *)PVar21.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar21.m_d.d == 0) {
      operator_delete((void *)PVar21.m_d.d,0x10);
    }
  }
  QtPromisePrivate::
  PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>::addCatcher
            ((PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>
              *)QVar29.d,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)&resolver_2);
  std::
  _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
  ::_M_manager((_Any_data *)&resolver_2,(_Any_data *)&resolver_2,__destroy_functor);
  if (PVar21.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar21.m_d.d = *(int *)PVar21.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar21.m_d.d == 0) {
      operator_delete((void *)PVar21.m_d.d,0x10);
    }
  }
  LOCK();
  *(int *)PVar21.m_d.d = *(int *)PVar21.m_d.d + -1;
  UNLOCK();
  if (*(int *)PVar21.m_d.d == 0) {
    operator_delete((void *)PVar21.m_d.d,0x10);
  }
  if (resolver_7.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_7.m_d.d = *(int *)resolver_7.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_7.m_d.d == 0) {
      operator_delete((void *)resolver_7.m_d.d,0x10);
    }
  }
  QVar29.d = QStack_2e0.d;
  bVar24 = QtPromisePrivate::
           PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>::
           isPending((PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>
                      *)QStack_2e0.d);
  if (!bVar24) {
    QtPromisePrivate::
    PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>::dispatch
              ((PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>
                *)QVar29.d);
  }
  if (local_2b8.d != (Data *)0x0) {
    (*(code *)local_2b8.d)((_Any_data *)&p,(_Any_data *)&p,__destroy_functor);
  }
  resolver_3.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       &PTR__QPromiseBase_0014f370;
  LOCK();
  pQVar64 = &((PromiseDataBase<int,_void_(const_int_&)> *)
             &(QVar29.d)->
              super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
             )->super_QSharedData;
  (pQVar64->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar64->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if (((pQVar64->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i == 0) &&
     (QStack_2e0.d != (PromiseData<(anonymous_namespace)::Enum1> *)0x0)) {
    (*((PromiseDataBase<int,_void_(const_int_&)> *)
      &(QStack_2e0.d)->
       super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
      )->_vptr_PromiseDataBase[1])();
  }
  local_174._0_4_ = (QAtomicInteger<int>)0xffffffff;
  this_04 = (PromiseData<QString> *)operator_new(0x58);
  (this_04->super_PromiseDataBase<QString,_void_(const_QString_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)
   &(this_04->super_PromiseDataBase<QString,_void_(const_QString_&)>).super_QSharedData = 0;
  (this_04->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_04->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_catchers.d.size = 0;
  (this_04->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_handlers.d.size = 0;
  (this_04->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_catchers.d.d = (Data *)0x0;
  (this_04->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_handlers.d.d = (Data *)0x0;
  (this_04->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  *(undefined8 *)&(this_04->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_lock = 0;
  *(undefined8 *)&(this_04->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_settled = 0;
  (this_04->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_error.m_data.
  _M_exception_object = (void *)0x0;
  (this_04->super_PromiseDataBase<QString,_void_(const_QString_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_00150568;
  QReadWriteLock::QReadWriteLock
            (&(this_04->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_lock,0);
  (this_04->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_settled = false;
  (this_04->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_handlers.d.d = (Data *)0x0;
  (this_04->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  (this_04->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_handlers.d.size = 0;
  (this_04->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_catchers.d.d = (Data *)0x0;
  (this_04->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_04->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_catchers.d.size = 0;
  (this_04->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_error.m_data.
  _M_exception_object = (void *)0x0;
  (this_04->super_PromiseDataBase<QString,_void_(const_QString_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_00150500;
  LOCK();
  pQVar64 = &(this_04->super_PromiseDataBase<QString,_void_(const_QString_&)>).super_QSharedData;
  (pQVar64->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar64->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar62 = &(this_04->super_PromiseDataBase<QString,_void_(const_QString_&)>).super_QSharedData;
  LOCK();
  pQVar64 = &(this_04->super_PromiseDataBase<QString,_void_(const_QString_&)>).super_QSharedData;
  (pQVar64->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar64->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  p_3.super_QPromiseBase<QString>._vptr_QPromiseBase = (_func_int **)local_174._4_8_;
  p_3.super_QPromiseBase<QString>.m_d.d = this_04;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver_8,(QPromise<void> *)&p_3);
  p_3.super_QPromiseBase<QString>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001501a0;
  if (p_3.super_QPromiseBase<QString>.m_d.d != (PromiseData<QString> *)0x0) {
    LOCK();
    pQVar64 = &((p_3.super_QPromiseBase<QString>.m_d.d)->
               super_PromiseDataBase<QString,_void_(const_QString_&)>).super_QSharedData;
    (pQVar64->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar64->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar64->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p_3.super_QPromiseBase<QString>.m_d.d != (PromiseData<QString> *)0x0)) {
      (*((p_3.super_QPromiseBase<QString>.m_d.d)->
        super_PromiseDataBase<QString,_void_(const_QString_&)>)._vptr_PromiseDataBase[1])();
    }
  }
  PVar17.m_d.d = resolver_8.m_d.d;
  if (resolver_8.m_d.d == (Data *)0x0) {
    local_328.first.wp.d = (Data *)0x0;
LAB_0010bf13:
    local_2f8.d._0_4_ = (int)CONCAT71(resolver_8.m_d.d._1_7_,1);
    local_2f0.d = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_8.m_d.d = *(int *)resolver_8.m_d.d + 1;
    UNLOCK();
    if (resolver_8.m_d.d == (Data *)0x0) {
      local_328.first.wp.d = (Data *)resolver_8.m_d.d;
      LOCK();
      iRam0000000000000000 = iRam0000000000000000 + 1;
      UNLOCK();
      goto LAB_0010bf13;
    }
    LOCK();
    *(int *)resolver_8.m_d.d = *(int *)resolver_8.m_d.d + 1;
    UNLOCK();
    local_328.first.wp.d = (Data *)resolver_8.m_d.d;
    LOCK();
    *(int *)resolver_8.m_d.d = *(int *)resolver_8.m_d.d + 1;
    UNLOCK();
    local_2f0.d = (Data *)resolver_8.m_d.d;
    LOCK();
    *(int *)resolver_8.m_d.d = *(int *)resolver_8.m_d.d + 1;
    UNLOCK();
    local_2f8.d = local_2f8.d & 0xffffffff00000000;
  }
  local_328.second.super__Function_base._M_functor._M_unused._M_object = local_174;
  resolver_3.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  QStack_2e0.d = (PromiseData<(anonymous_namespace)::Enum1> *)0x0;
  local_2d8 = (PromiseData<(anonymous_namespace)::Enum1> *)0x0;
  pfStack_2d0 = (function<void_(const_QtPromisePrivate::PromiseError_&)> *)0x0;
  local_328.first.wp.value = (QObject *)local_2f0;
  resolver_3.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       operator_new(0x18);
  *(Data **)resolver_3.m_d.d = local_328.first.wp.d;
  if ((Data *)local_328.first.wp.d != (Data *)0x0) {
    LOCK();
    (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  ((Data *)resolver_3.m_d.d)->promise = (QPromise<void> *)local_328.first.wp.value;
  if ((Data *)local_328.first.wp.value == (Data *)0x0) {
    *(void **)((long)resolver_3.m_d.d + 0x10) =
         local_328.second.super__Function_base._M_functor._M_unused._M_object;
    pfStack_2d0 = (function<void_(const_QtPromisePrivate::PromiseError_&)> *)
                  std::
                  _Function_handler<void_(const_(anonymous_namespace)::Bar_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                  ::_M_invoke;
    local_2d8 = (PromiseData<(anonymous_namespace)::Enum1> *)
                std::
                _Function_handler<void_(const_(anonymous_namespace)::Bar_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                ::_M_manager;
  }
  else {
    LOCK();
    (((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    *(void **)((long)resolver_3.m_d.d + 0x10) =
         local_328.second.super__Function_base._M_functor._M_unused._M_object;
    pfStack_2d0 = (function<void_(const_QtPromisePrivate::PromiseError_&)> *)
                  std::
                  _Function_handler<void_(const_(anonymous_namespace)::Bar_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                  ::_M_invoke;
    local_2d8 = (PromiseData<(anonymous_namespace)::Enum1> *)
                std::
                _Function_handler<void_(const_(anonymous_namespace)::Bar_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                ::_M_manager;
    if ((Data *)local_328.first.wp.value != (Data *)0x0) {
      LOCK();
      (((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           (((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
        operator_delete(local_328.first.wp.value,0x10);
      }
    }
  }
  if ((Data *)local_328.first.wp.d != (Data *)0x0) {
    LOCK();
    (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_328.first.wp.d,0x10);
    }
  }
  QReadWriteLock::lockForWrite();
  local_174._4_8_ = (ulong)&this_03->m_lock | 1;
  pDVar52 = (Data *)QThread::currentThread();
  if (pDVar52 == (Data *)0x0) {
    pDVar40 = (Data *)0x0;
  }
  else {
    pDVar40 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)pDVar52);
  }
  pfVar48 = pfStack_2d0;
  pPVar28 = local_2d8;
  local_2b8.d = (Data *)0x0;
  pPStack_2b0 = (PromiseData<(anonymous_namespace)::Enum1> *)0x0;
  local_2a8 = (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
               *)0x0;
  pfStack_2a0 = pfStack_2d0;
  if (local_2d8 != (PromiseData<(anonymous_namespace)::Enum1> *)0x0) {
    local_2b8.d = (Data *)resolver_3.m_d.d;
    pPStack_2b0 = QStack_2e0.d;
    local_2a8 = (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
                 *)local_2d8;
    local_2d8 = (PromiseData<(anonymous_namespace)::Enum1> *)0x0;
    pfStack_2d0 = (function<void_(const_QtPromisePrivate::PromiseError_&)> *)0x0;
  }
  pDVar4 = (this_03->m_handlers).d.d;
  pfVar7 = (function<void_(const_QtPromisePrivate::PromiseError_&)> *)(this_03->m_handlers).d.size;
  if ((pDVar4 != (Data *)0x0) &&
     ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    ppVar8 = (this_03->m_handlers).d.ptr;
    ppVar60 = (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)
              ((ulong)((long)&pDVar4[1].super_QArrayData.flags.i + 3U) & 0xfffffffffffffff8);
    if ((pDVar4->super_QArrayData).alloc - (long)pfVar7 ==
        ((long)ppVar8 - (long)ppVar60 >> 4) * -0x5555555555555555) {
      if ((pfVar7 != (function<void_(const_QtPromisePrivate::PromiseError_&)> *)0x0) ||
         (ppVar60 == ppVar8)) goto LAB_0010c087;
      ppVar8[-1].first.wp.d = (Data *)pDVar40;
      ppVar8[-1].first.wp.value = (QObject *)pDVar52;
      *(undefined8 *)&ppVar8[-1].second.super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&ppVar8[-1].second.super__Function_base._M_functor + 8) = 0;
      ppVar8[-1].second.super__Function_base._M_manager = (_Manager_type)0x0;
      ppVar8[-1].second._M_invoker = (_Invoker_type)pfVar48;
      if (pPVar28 != (PromiseData<(anonymous_namespace)::Enum1> *)0x0) {
        *(Data **)&ppVar8[-1].second.super__Function_base._M_functor = local_2b8.d;
        *(PromiseData<(anonymous_namespace)::Enum1> **)
         ((long)&ppVar8[-1].second.super__Function_base._M_functor + 8) = pPStack_2b0;
        ppVar8[-1].second.super__Function_base._M_manager = (_Manager_type)local_2a8;
        local_2a8 = (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
                     *)0x0;
        pfStack_2a0 = (function<void_(const_QtPromisePrivate::PromiseError_&)> *)0x0;
      }
      pppVar1 = &(this_03->m_handlers).d.ptr;
      *pppVar1 = *pppVar1 + -1;
    }
    else {
      ppVar8[(long)pfVar7].first.wp.d = (Data *)pDVar40;
      ppVar8[(long)pfVar7].first.wp.value = (QObject *)pDVar52;
      *(undefined8 *)&ppVar8[(long)pfVar7].second.super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&ppVar8[(long)pfVar7].second.super__Function_base._M_functor + 8) = 0;
      ppVar8[(long)pfVar7].second.super__Function_base._M_manager = (_Manager_type)0x0;
      ppVar8[(long)pfVar7].second._M_invoker = (_Invoker_type)pfVar48;
      if (pPVar28 != (PromiseData<(anonymous_namespace)::Enum1> *)0x0) {
        *(Data **)&ppVar8[(long)pfVar7].second.super__Function_base._M_functor = local_2b8.d;
        *(PromiseData<(anonymous_namespace)::Enum1> **)
         ((long)&ppVar8[(long)pfVar7].second.super__Function_base._M_functor + 8) = pPStack_2b0;
        ppVar8[(long)pfVar7].second.super__Function_base._M_manager = (_Manager_type)local_2a8;
        local_2a8 = (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
                     *)0x0;
        pfStack_2a0 = (function<void_(const_QtPromisePrivate::PromiseError_&)> *)0x0;
      }
    }
    p.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x0;
    p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)0x0;
    pqVar2 = &(this_03->m_handlers).d.size;
    *pqVar2 = *pqVar2 + 1;
    goto LAB_0010c4fe;
  }
LAB_0010c087:
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)0x0;
  p.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x0;
  local_328.second.super__Function_base._M_functor._M_unused._M_object = (Data *)0x0;
  local_328.second.super__Function_base._M_functor._8_8_ = 0;
  local_328.second.super__Function_base._M_manager = (_Manager_type)0x0;
  local_328.second._M_invoker = (_Invoker_type)pfVar48;
  n = pfVar48;
  if (pPVar28 != (PromiseData<(anonymous_namespace)::Enum1> *)0x0) {
    n = &local_328.second;
    local_328.second.super__Function_base._M_functor._M_unused._M_object = local_2b8.d;
    local_328.second.super__Function_base._M_functor._8_8_ = pPStack_2b0;
    local_328.second.super__Function_base._M_manager = (_Manager_type)pPVar28;
    local_2a8 = (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
                 *)0x0;
    pfStack_2a0 = (function<void_(const_QtPromisePrivate::PromiseError_&)> *)0x0;
  }
  local_140 = pQVar62;
  local_328.first.wp.d = (Data *)pDVar40;
  local_328.first.wp.value = (QObject *)pDVar52;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_0010c0e5:
    QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
    ::reallocateAndGrow((QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
                         *)&this_03->m_handlers,GrowsAtEnd,(qsizetype)n,
                        (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
                         *)pPVar28);
    ppVar41 = (pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_> *)
              (this_03->m_handlers).d.ptr;
  }
  else {
    pQVar9 = (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
              *)(pDVar4->super_QArrayData).alloc;
    ppVar41 = (pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_> *)
              (this_03->m_handlers).d.ptr;
    n = (function<void_(const_QtPromisePrivate::PromiseError_&)> *)
        ((long)ppVar41 -
        ((ulong)((long)&pDVar4[1].super_QArrayData.flags.i + 3) & 0xfffffffffffffff8));
    lVar50 = (long)n >> 4;
    if ((long)pQVar9 + (lVar50 * 0x5555555555555555 - (long)pfVar7) < 1) {
      pPVar28 = (PromiseData<(anonymous_namespace)::Enum1> *)pQVar9;
      if (((long)n < 1) ||
         (pPVar28 = (PromiseData<(anonymous_namespace)::Enum1> *)((long)pQVar9 * 2), n = pfVar7,
         SBORROW8((long)pfVar7 * 3,(long)pPVar28) == (long)pfVar7 * 3 + (long)pQVar9 * -2 < 0))
      goto LAB_0010c0e5;
      ppVar61 = (pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>
                 *)(lVar50 * -0x10 + (long)ppVar41);
      if (ppVar41 !=
          (pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_> *)0x0
          && pfVar7 != (function<void_(const_QtPromisePrivate::PromiseError_&)> *)0x0) {
        local_208 = ppVar61;
        ppVar55 = ppVar61 + (long)pfVar7;
        ppVar46 = ppVar41;
        ppVar14 = ppVar55;
        if (ppVar41 < ppVar55) {
          ppVar46 = ppVar55;
          ppVar14 = ppVar41;
        }
        this_05 = ppVar61;
        if (ppVar14 != ppVar61) {
          lVar50 = lVar50 * -0x10;
          do {
            pQVar38 = (ppVar41->first).wp.value;
            (((pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_> *)
             ((long)ppVar41 + lVar50))->first).wp.d = (ppVar41->first).wp.d;
            (((pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_> *)
             ((long)ppVar41 + lVar50))->first).wp.value = pQVar38;
            (ppVar41->first).wp.d = (Data *)0x0;
            (ppVar41->first).wp.value = (QObject *)0x0;
            puVar35 = (undefined8 *)((long)ppVar41 + lVar50 + 0x10);
            *puVar35 = 0;
            puVar35[1] = 0;
            *(undefined8 *)((long)ppVar41 + lVar50 + 0x20) = 0;
            *(_Invoker_type *)((long)ppVar41 + lVar50 + 0x28) = (ppVar41->second)._M_invoker;
            if ((ppVar41->second).super__Function_base._M_manager != (_Manager_type)0x0) {
              uVar12 = *(undefined8 *)((long)&(ppVar41->second).super__Function_base._M_functor + 8)
              ;
              *(undefined8 *)((long)ppVar41 + lVar50 + 0x10) =
                   *(undefined8 *)&(ppVar41->second).super__Function_base._M_functor;
              *(undefined8 *)((long)ppVar41 + lVar50 + 0x18) = uVar12;
              *(_Manager_type *)((long)ppVar41 + lVar50 + 0x20) =
                   (ppVar41->second).super__Function_base._M_manager;
              (ppVar41->second).super__Function_base._M_manager = (_Manager_type)0x0;
              (ppVar41->second)._M_invoker = (_Invoker_type)0x0;
            }
            ppVar47 = (pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>
                       *)((long)ppVar41 + lVar50 + 0x30);
            ppVar41 = ppVar41 + 1;
            this_05 = ppVar14;
          } while (ppVar47 != ppVar14);
        }
        resolver_7.m_d.d =
             (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Bar>::Data>
              )&local_200;
        local_200 = this_05;
        for (; this_05 != ppVar55; this_05 = this_05 + 1) {
          std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>::
          operator=(this_05,ppVar41);
          ppVar41 = ppVar41 + 1;
        }
        resolver_7.m_d.d =
             (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Bar>::Data>
              )(Data *)&local_208;
        while (ppVar41 != ppVar46) {
          p_Var10 = ppVar41[-1].second.super__Function_base._M_manager;
          if (p_Var10 != (_Manager_type)0x0) {
            (*p_Var10)((_Any_data *)&ppVar41[-1].second,(_Any_data *)&ppVar41[-1].second,
                       __destroy_functor);
          }
          ppVar41 = ppVar41 + -1;
          pDVar59 = (ppVar41->first).wp.d;
          if (pDVar59 != (Data *)0x0) {
            LOCK();
            *(int *)pDVar59 = *(int *)pDVar59 + -1;
            UNLOCK();
            if (*(int *)pDVar59 == 0) {
              pDVar59 = (ppVar41->first).wp.d;
              if (pDVar59 == (Data *)0x0) {
                pDVar59 = (Data *)0x0;
              }
              operator_delete(pDVar59);
            }
          }
        }
        ppVar41 = *(pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>
                    **)resolver_7.m_d.d;
        if (ppVar41 != local_208) {
          bVar24 = ppVar41 < local_208;
          do {
            *(pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_> **)
             resolver_7.m_d.d = ppVar41 + ((ulong)bVar24 - 1 | 1);
            plVar30 = *(long **)resolver_7.m_d.d;
            if ((code *)plVar30[4] != (code *)0x0) {
              (*(code *)plVar30[4])(plVar30 + 2,plVar30 + 2,3);
            }
            piVar11 = (int *)*plVar30;
            if (piVar11 != (int *)0x0) {
              LOCK();
              *piVar11 = *piVar11 + -1;
              UNLOCK();
              if (*piVar11 == 0) {
                pvVar58 = (void *)*plVar30;
                if (pvVar58 == (void *)0x0) {
                  pvVar58 = (void *)0x0;
                }
                operator_delete(pvVar58);
              }
            }
            ppVar41 = *(pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>
                        **)resolver_7.m_d.d;
          } while (ppVar41 != local_208);
        }
      }
      (this_03->m_handlers).d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)ppVar61;
      ppVar41 = ppVar61;
    }
  }
  lVar50 = (this_03->m_handlers).d.size;
  ppVar61 = ppVar41 + lVar50;
  lVar45 = lVar50 - (long)pfVar7;
  if (lVar45 < 1) {
    (ppVar61->first).wp.d = local_328.first.wp.d;
    (ppVar61->first).wp.value = local_328.first.wp.value;
    local_328.first.wp.d = (Data *)0x0;
    local_328.first.wp.value = (QObject *)0x0;
    *(undefined8 *)&(ppVar61->second).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(ppVar61->second).super__Function_base._M_functor + 8) = 0;
    (ppVar61->second).super__Function_base._M_manager = (_Manager_type)0x0;
    (ppVar61->second)._M_invoker = (_Invoker_type)local_328.second._M_invoker;
    if ((QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
         *)local_328.second.super__Function_base._M_manager !=
        (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
         *)0x0) {
      *(void **)&(ppVar61->second).super__Function_base._M_functor =
           local_328.second.super__Function_base._M_functor._M_unused._M_object;
      *(undefined8 *)((long)&(ppVar61->second).super__Function_base._M_functor + 8) =
           local_328.second.super__Function_base._M_functor._8_8_;
      (ppVar61->second).super__Function_base._M_manager =
           local_328.second.super__Function_base._M_manager;
      local_328.second.super__Function_base._M_manager = (_Manager_type)0x0;
      local_328.second._M_invoker = (_Invoker_type)0x0;
    }
    (this_03->m_handlers).d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)ppVar41;
    (this_03->m_handlers).d.size = lVar50 + 1;
  }
  else {
    pQVar38 = ppVar61[-1].first.wp.value;
    (ppVar61->first).wp.d = ppVar61[-1].first.wp.d;
    (ppVar61->first).wp.value = pQVar38;
    ppVar41[lVar50 + -1].first.wp.d = (Data *)0x0;
    ppVar41[lVar50 + -1].first.wp.value = (QObject *)0x0;
    *(undefined8 *)&(ppVar61->second).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(ppVar61->second).super__Function_base._M_functor + 8) = 0;
    (ppVar61->second).super__Function_base._M_manager = (_Manager_type)0x0;
    p_Var10 = ppVar61[-1].second.super__Function_base._M_manager;
    (ppVar61->second)._M_invoker = ppVar61[-1].second._M_invoker;
    if (p_Var10 != (_Manager_type)0x0) {
      uVar12 = *(undefined8 *)((long)&ppVar61[-1].second.super__Function_base._M_functor + 8);
      *(undefined8 *)&(ppVar61->second).super__Function_base._M_functor =
           *(undefined8 *)&ppVar61[-1].second.super__Function_base._M_functor;
      *(undefined8 *)((long)&(ppVar61->second).super__Function_base._M_functor + 8) = uVar12;
      (ppVar61->second).super__Function_base._M_manager = p_Var10;
      ppVar61[-1].second.super__Function_base._M_manager = (_Manager_type)0x0;
      ppVar61[-1].second._M_invoker = (_Invoker_type)0x0;
    }
    if (lVar45 != 1) {
      lVar45 = 1 - lVar45;
      ppVar61 = ppVar41 + lVar50 + -1;
      do {
        std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>::
        operator=(ppVar61,ppVar61 + -1);
        lVar45 = lVar45 + 1;
        ppVar61 = ppVar61 + -1;
      } while (lVar45 != 0);
    }
    std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>::
    operator=(ppVar41 + (long)pfVar7,(type)&local_328);
    (this_03->m_handlers).d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)ppVar41;
    (this_03->m_handlers).d.size = lVar50 + 1;
    if ((QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
         *)local_328.second.super__Function_base._M_manager !=
        (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
         *)0x0) {
      (*local_328.second.super__Function_base._M_manager)(&local_328.second,&local_328.second,3);
    }
  }
  pQVar62 = local_140;
  if ((Data *)local_328.first.wp.d != (Data *)0x0) {
    LOCK();
    (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      pDVar52 = (Data *)local_328.first.wp.d;
      if ((Data *)local_328.first.wp.d == (Data *)0x0) {
        pDVar52 = (Data *)0x0;
      }
      operator_delete(pDVar52);
    }
  }
  if (local_2a8 !=
      (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
       *)0x0) {
    (*(code *)local_2a8)(&local_2b8,&local_2b8,3);
  }
LAB_0010c4fe:
  if (p.super_QPromiseBase<int>._vptr_QPromiseBase != (_func_int **)0x0) {
    LOCK();
    *(int *)p.super_QPromiseBase<int>._vptr_QPromiseBase =
         *(int *)p.super_QPromiseBase<int>._vptr_QPromiseBase + -1;
    UNLOCK();
    if (*(int *)p.super_QPromiseBase<int>._vptr_QPromiseBase == 0) {
      pp_Var56 = p.super_QPromiseBase<int>._vptr_QPromiseBase;
      if (p.super_QPromiseBase<int>._vptr_QPromiseBase == (_func_int **)0x0) {
        pp_Var56 = (_func_int **)0x0;
      }
      operator_delete(pp_Var56);
    }
  }
  QReadWriteLock::unlock();
  if (local_2d8 != (PromiseData<(anonymous_namespace)::Enum1> *)0x0) {
    (*(code *)local_2d8)(&resolver_3,&resolver_3,3);
  }
  if ((char)local_2f8.d == '\0') {
    LOCK();
    ((local_2f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_2f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data>)(Data *)0x0;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data>)
       operator_new(8);
  *(Data **)resolver.m_d.d = local_2f0.d;
  if ((char)local_2f8.d == '\0') {
    LOCK();
    ((local_2f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_2f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    LOCK();
    ((local_2f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_2f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_2f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_2f0.d,0x10);
    }
  }
  QReadWriteLock::lockForWrite();
  uVar12 = local_174._4_8_;
  pQVar38 = (QObject *)QThread::currentThread();
  if (pQVar38 == (QObject *)0x0) {
    local_328.first.wp.d = (Data *)0x0;
  }
  else {
    local_328.first.wp.d = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar38);
  }
  local_328.second._M_invoker =
       std::
       _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
       ::_M_invoke;
  local_328.second.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
       ::_M_manager;
  local_328.second.super__Function_base._M_functor._M_unused._M_object = (void *)resolver.m_d.d;
  local_328.second.super__Function_base._M_functor._8_8_ = 0;
  local_328.first.wp.value = pQVar38;
  QtPrivate::
  QGenericArrayOps<std::pair<QPointer<QThread>,std::function<void(QtPromisePrivate::PromiseError_const&)>>>
  ::emplace<std::pair<QPointer<QThread>,std::function<void(QtPromisePrivate::PromiseError_const&)>>>
            ((QGenericArrayOps<std::pair<QPointer<QThread>,std::function<void(QtPromisePrivate::PromiseError_const&)>>>
              *)&this_03->m_catchers,(this_03->m_catchers).d.size,&local_328);
  if (local_328.second.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_328.second.super__Function_base._M_manager)
              ((_Any_data *)&local_328.second,(_Any_data *)&local_328.second,__destroy_functor);
  }
  if (local_328.first.wp.d != (Data *)0x0) {
    LOCK();
    *(int *)local_328.first.wp.d = *(int *)local_328.first.wp.d + -1;
    UNLOCK();
    if (*(int *)local_328.first.wp.d == 0) {
      pDVar59 = local_328.first.wp.d;
      if (local_328.first.wp.d == (Data *)0x0) {
        pDVar59 = (Data *)0x0;
      }
      operator_delete(pDVar59);
    }
  }
  if ((uVar12 & 1) != 0) {
    QReadWriteLock::unlock();
  }
  if ((char)local_2f8.d == '\0') {
    LOCK();
    ((local_2f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_2f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_2f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_2f0.d,0x10);
    }
  }
  if (PVar17.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar17.m_d.d = *(int *)PVar17.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar17.m_d.d == 0) {
      operator_delete((void *)PVar17.m_d.d,0x10);
    }
  }
  if (resolver_8.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_8.m_d.d = *(int *)resolver_8.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_8.m_d.d == 0) {
      operator_delete((void *)resolver_8.m_d.d,0x10);
    }
  }
  bVar24 = QtPromisePrivate::
           PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>::
           isPending(this_03);
  if (!bVar24) {
    QtPromisePrivate::
    PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>::dispatch
              (this_03);
  }
  bVar24 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                     ((PromiseDataBase<void,_void_()> *)this_04);
  while (bVar24 != false) {
    QCoreApplication::processEvents();
    QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
    bVar24 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                       ((PromiseDataBase<void,_void_()> *)this_04);
  }
  LOCK();
  (pQVar62->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar62->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (pQVar62->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar62->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar62->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*(this_04->super_PromiseDataBase<QString,_void_(const_QString_&)>)._vptr_PromiseDataBase[1])
              (this_04);
  }
  LOCK();
  (pQVar62->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar62->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar62->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*(this_04->super_PromiseDataBase<QString,_void_(const_QString_&)>)._vptr_PromiseDataBase[1])
              (this_04);
  }
  cVar23 = QTest::compare_helper
                     ((Type)local_174._0_4_ == 0x2a,"Compared values are not the same",(char *)0x0,
                      (char *)0x0,"waitForValue(p, Bar{})","Bar{42}",
                      "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                      ,0x83);
  if (cVar23 == '\0') {
    cVar23 = '\0';
  }
  else {
    bVar24 = QtPromisePrivate::
             PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
             ::isPending(this_03);
    cVar23 = QTest::qVerify((bool)(~bVar24 &
                                  (this_03->m_error).m_data._M_exception_object == (void *)0x0),
                            "p.isFulfilled()","",
                            "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                            ,0x84);
  }
  LOCK();
  (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_03->_vptr_PromiseDataBase[1])(this_03);
  }
  if (cVar23 != '\0') {
    p.super_QPromiseBase<int>._vptr_QPromiseBase =
         (_func_int **)CONCAT44(p.super_QPromiseBase<int>._vptr_QPromiseBase._4_4_,0x2a);
    QtPromise::resolve<int>((QtPromise *)&local_328,(int *)&p);
    QtPromise::QPromise<int>::convert<QString>((QPromise<int> *)&p_3);
    local_328.first.wp.d = (Data *)&PTR__QPromiseBase_00150110;
    if (local_328.first.wp.value != (QObject *)0x0) {
      LOCK();
      pQVar38 = local_328.first.wp.value + 8;
      *(int *)pQVar38 = *(int *)pQVar38 + -1;
      UNLOCK();
      if ((*(int *)pQVar38 == 0) && (local_328.first.wp.value != (QObject *)0x0)) {
        (**(code **)(*(long *)&(local_328.first.wp.value)->field_0x0 + 8))();
      }
    }
    p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)0x0;
    p.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x0;
    local_2b8.d = (Data *)0x0;
    waitForValue<QString>((QString *)&local_328,&p_3,(QString *)&p);
    QString::QString((QString *)&resolver_7,"42");
    QVar67.m_data = (storage_type_conflict *)local_328.first.wp.value;
    QVar67.m_size = local_328.second.super__Function_base._M_functor._M_unused._0_8_;
    QVar70.m_data = (storage_type_conflict *)local_208;
    QVar70.m_size = (qsizetype)local_200;
    cVar23 = QTest::qCompare(QVar67,QVar70,"waitForValue(p, QString{})","QString{\"42\"}",
                             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                             ,0x8d);
    if (resolver_7.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)resolver_7.m_d.d = *(int *)resolver_7.m_d.d + -1;
      UNLOCK();
      if (*(int *)resolver_7.m_d.d == 0) {
        QArrayData::deallocate((QArrayData *)resolver_7.m_d.d,2,8);
      }
    }
    if ((QArrayData *)local_328.first.wp.d != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).super___atomic_base<int>.
      _M_i = (((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).
             super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_328.first.wp.d,2,8);
      }
    }
    if (p.super_QPromiseBase<int>._vptr_QPromiseBase != (_func_int **)0x0) {
      LOCK();
      *(int *)p.super_QPromiseBase<int>._vptr_QPromiseBase =
           *(int *)p.super_QPromiseBase<int>._vptr_QPromiseBase + -1;
      UNLOCK();
      if (*(int *)p.super_QPromiseBase<int>._vptr_QPromiseBase == 0) {
        QArrayData::deallocate((QArrayData *)p.super_QPromiseBase<int>._vptr_QPromiseBase,2,8);
      }
    }
    QVar20.d = p_3.super_QPromiseBase<QString>.m_d.d;
    if (cVar23 == '\0') {
      cVar23 = '\0';
    }
    else {
      bVar24 = QtPromisePrivate::PromiseDataBase<QString,_void_(const_QString_&)>::isPending
                         (&(p_3.super_QPromiseBase<QString>.m_d.d)->
                           super_PromiseDataBase<QString,_void_(const_QString_&)>);
      cVar23 = QTest::qVerify((bool)(~bVar24 &
                                    ((QVar20.d)->
                                    super_PromiseDataBase<QString,_void_(const_QString_&)>).m_error.
                                    m_data._M_exception_object == (void *)0x0),"p.isFulfilled()","",
                              "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                              ,0x8e);
    }
    p_3.super_QPromiseBase<QString>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00150170;
    if (p_3.super_QPromiseBase<QString>.m_d.d != (PromiseData<QString> *)0x0) {
      LOCK();
      pQVar32 = &((p_3.super_QPromiseBase<QString>.m_d.d)->
                 super_PromiseDataBase<QString,_void_(const_QString_&)>).super_QSharedData;
      (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i == 0) &&
         (p_3.super_QPromiseBase<QString>.m_d.d != (PromiseData<QString> *)0x0)) {
        (*((p_3.super_QPromiseBase<QString>.m_d.d)->
          super_PromiseDataBase<QString,_void_(const_QString_&)>)._vptr_PromiseDataBase[1])();
      }
    }
    if (cVar23 != '\0') {
      p.super_QPromiseBase<int>._vptr_QPromiseBase =
           (_func_int **)CONCAT44(p.super_QPromiseBase<int>._vptr_QPromiseBase._4_4_,0x2a);
      QtPromise::resolve<(anonymous_namespace)::Foo>((QtPromise *)&local_328,(Foo *)&p);
      QtPromise::QPromise<(anonymous_namespace)::Foo>::convert<QString>
                ((QPromise<(anonymous_namespace)::Foo> *)&p_3);
      local_328.first.wp.d = (Data *)&PTR__QPromiseBase_0014f370;
      if (local_328.first.wp.value != (QObject *)0x0) {
        LOCK();
        pQVar38 = local_328.first.wp.value + 8;
        *(int *)pQVar38 = *(int *)pQVar38 + -1;
        UNLOCK();
        if ((*(int *)pQVar38 == 0) && (local_328.first.wp.value != (QObject *)0x0)) {
          (**(code **)(*(long *)&(local_328.first.wp.value)->field_0x0 + 8))();
        }
      }
      p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)0x0;
      p.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x0;
      local_2b8.d = (Data *)0x0;
      waitForValue<QString>((QString *)&local_328,&p_3,(QString *)&p);
      QString::QString((QString *)&resolver_7,"Foo{42}");
      QVar68.m_data = (storage_type_conflict *)local_328.first.wp.value;
      QVar68.m_size = local_328.second.super__Function_base._M_functor._M_unused._0_8_;
      QVar71.m_data = (storage_type_conflict *)local_208;
      QVar71.m_size = (qsizetype)local_200;
      cVar23 = QTest::qCompare(QVar68,QVar71,"waitForValue(p, QString{})","QString{\"Foo{42}\"}",
                               "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                               ,0x98);
      if (resolver_7.m_d.d != (Data *)0x0) {
        LOCK();
        *(int *)resolver_7.m_d.d = *(int *)resolver_7.m_d.d + -1;
        UNLOCK();
        if (*(int *)resolver_7.m_d.d == 0) {
          QArrayData::deallocate((QArrayData *)resolver_7.m_d.d,2,8);
        }
      }
      if ((QArrayData *)local_328.first.wp.d != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).super___atomic_base<int>
        ._M_i = (((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).
                super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_328.first.wp.d,2,8);
        }
      }
      if (p.super_QPromiseBase<int>._vptr_QPromiseBase != (_func_int **)0x0) {
        LOCK();
        *(int *)p.super_QPromiseBase<int>._vptr_QPromiseBase =
             *(int *)p.super_QPromiseBase<int>._vptr_QPromiseBase + -1;
        UNLOCK();
        if (*(int *)p.super_QPromiseBase<int>._vptr_QPromiseBase == 0) {
          QArrayData::deallocate((QArrayData *)p.super_QPromiseBase<int>._vptr_QPromiseBase,2,8);
        }
      }
      QVar20.d = p_3.super_QPromiseBase<QString>.m_d.d;
      if (cVar23 == '\0') {
        if (p_3.super_QPromiseBase<QString>.m_d.d == (PromiseData<QString> *)0x0) {
          return;
        }
      }
      else {
        bVar24 = QtPromisePrivate::PromiseDataBase<QString,_void_(const_QString_&)>::isPending
                           (&(p_3.super_QPromiseBase<QString>.m_d.d)->
                             super_PromiseDataBase<QString,_void_(const_QString_&)>);
        QTest::qVerify((bool)(~bVar24 &
                             ((QVar20.d)->super_PromiseDataBase<QString,_void_(const_QString_&)>).
                             m_error.m_data._M_exception_object == (void *)0x0),"p.isFulfilled()",""
                       ,
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                       ,0x99);
      }
      p_3.super_QPromiseBase<QString>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00150170
      ;
      LOCK();
      pQVar32 = &((QVar20.d)->super_PromiseDataBase<QString,_void_(const_QString_&)>).
                 super_QSharedData;
      (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i == 0) &&
         (p_3.super_QPromiseBase<QString>.m_d.d != (PromiseData<QString> *)0x0)) {
        (*((p_3.super_QPromiseBase<QString>.m_d.d)->
          super_PromiseDataBase<QString,_void_(const_QString_&)>)._vptr_PromiseDataBase[1])();
      }
    }
  }
  return;
}

Assistant:

void tst_qpromise_convert::fulfillTAsU()
{
    // Static cast between primitive types.
    {
        auto p = QtPromise::resolve(42.13).convert<int>();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<int>>::value));

        QCOMPARE(waitForValue(p, -1), 42);
        QVERIFY(p.isFulfilled());
    }

    // Convert enum class to int.
    {
        auto p = QtPromise::resolve(Enum1::Value1).convert<int>();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<int>>::value));

        QCOMPARE(waitForValue(p, -1), 1);
        QVERIFY(p.isFulfilled());
    }

    // Convert int to enum class.
    {
        auto p = QtPromise::resolve(1).convert<Enum1>();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<Enum1>>::value));

        QCOMPARE(waitForValue(p, Enum1::Value0), Enum1::Value1);
        QVERIFY(p.isFulfilled());
    }

    // Convert between enums
    {
        auto p = QtPromise::resolve(Enum1::Value1).convert<Enum2>();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<Enum2>>::value));

        QCOMPARE(waitForValue(p, Enum2::Value0), Enum2::Value1);
        QVERIFY(p.isFulfilled());
    }

    // Converting constructor for Qt types.
    // https://en.cppreference.com/w/cpp/language/converting_constructor
    {
        auto p = QtPromise::resolve(QByteArray{"foo"}).convert<QString>();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QString>>::value));

        QCOMPARE(waitForValue(p, QString{}), QString{"foo"});
        QVERIFY(p.isFulfilled());
    }

    // Converting constructor for non-Qt types.
    // https://en.cppreference.com/w/cpp/language/converting_constructor
    {
        auto p = QtPromise::resolve(Foo{42}).convert<Bar>();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<Bar>>::value));

        QCOMPARE(waitForValue(p, Bar{}), Bar{42});
        QVERIFY(p.isFulfilled());
    }

    // Conversion of types Qt is aware of via QVariant.
    {
        auto p = QtPromise::resolve(42).convert<QString>();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QString>>::value));

        QCOMPARE(waitForValue(p, QString{}), QString{"42"});
        QVERIFY(p.isFulfilled());
    }

    // Conversion of a non-Qt type via QVariant.
    // https://doc.qt.io/qt-5/qmetatype.html#registerConverter
    {
        auto p = QtPromise::resolve(Foo{42}).convert<QString>();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QString>>::value));

        QCOMPARE(waitForValue(p, QString{}), QString{"Foo{42}"});
        QVERIFY(p.isFulfilled());
    }
}